

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl.h
# Opt level: O3

int gladLoadGLUserPtr(GLADuserptrloadfunc load,void *userptr)

{
  int iVar1;
  int iVar2;
  GLubyte *pGVar3;
  size_t sVar4;
  char **exts_i;
  char *pcVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  bool bVar12;
  uint num_exts_i;
  int minor;
  int major;
  uint local_40;
  uint local_3c;
  int local_38;
  int local_34;
  
  glad_glGetString = (PFNGLGETSTRINGPROC)(*load)(userptr,"glGetString");
  if (glad_glGetString == (PFNGLGETSTRINGPROC)0x0) {
    return 0;
  }
  pGVar3 = (*glad_glGetString)(0x1f02);
  if (pGVar3 == (GLubyte *)0x0) {
    return 0;
  }
  iVar1 = 0;
  local_34 = 0;
  local_38 = 0;
  pGVar3 = (*glad_glGetString)(0x1f02);
  if (pGVar3 != (GLubyte *)0x0) {
    lVar8 = 0;
    do {
      pcVar5 = *(char **)((long)&PTR_anon_var_dwarf_67fd_001510e0 + lVar8);
      sVar4 = strlen(pcVar5);
      iVar1 = strncmp((char *)pGVar3,pcVar5,sVar4);
      if (iVar1 == 0) {
        pGVar3 = pGVar3 + sVar4;
        break;
      }
      lVar8 = lVar8 + 8;
    } while (lVar8 != 0x20);
    __isoc99_sscanf(pGVar3,"%d.%d",&local_34,&local_38);
    GLAD_GL_VERSION_1_5 = (int)(1 < local_34);
    GLAD_GL_VERSION_3_0 = (int)(3 < local_34);
    uVar10 = (uint)(3 < local_34);
    uVar6 = (uint)(1 < local_34);
    GLAD_GL_VERSION_3_3 = uVar10;
    GLAD_GL_VERSION_1_3 = GLAD_GL_VERSION_1_5;
    if (2 < local_38) {
      GLAD_GL_VERSION_1_3 = 1;
      GLAD_GL_VERSION_3_3 = 1;
    }
    if (local_34 != 3) {
      GLAD_GL_VERSION_3_3 = uVar10;
    }
    GLAD_GL_VERSION_3_2 = uVar10;
    GLAD_GL_VERSION_1_2 = GLAD_GL_VERSION_1_5;
    if (1 < local_38) {
      GLAD_GL_VERSION_1_2 = 1;
      GLAD_GL_VERSION_3_2 = 1;
    }
    GLAD_GL_VERSION_2_1 = (int)(2 < local_34);
    uVar7 = (uint)(2 < local_34);
    if (local_34 != 3) {
      GLAD_GL_VERSION_3_2 = uVar10;
    }
    bVar12 = -1 < local_38;
    GLAD_GL_VERSION_1_0 = GLAD_GL_VERSION_1_5;
    if (bVar12) {
      GLAD_GL_VERSION_1_0 = 1;
    }
    GLAD_GL_VERSION_1_1 = GLAD_GL_VERSION_1_5;
    if (0 < local_38) {
      GLAD_GL_VERSION_1_1 = 1;
    }
    GLAD_GL_VERSION_2_0 = uVar7;
    if (bVar12) {
      GLAD_GL_VERSION_2_0 = 1;
    }
    if (0 < local_38) {
      GLAD_GL_VERSION_2_1 = 1;
    }
    if (bVar12) {
      GLAD_GL_VERSION_3_0 = 1;
    }
    GLAD_GL_VERSION_3_1 = uVar10;
    if (0 < local_38) {
      GLAD_GL_VERSION_3_1 = 1;
    }
    if (local_34 != 3) {
      GLAD_GL_VERSION_3_1 = uVar10;
      GLAD_GL_VERSION_3_0 = uVar10;
    }
    if (local_34 != 2) {
      GLAD_GL_VERSION_2_1 = uVar7;
      GLAD_GL_VERSION_2_0 = uVar7;
    }
    GLAD_GL_VERSION_1_4 = GLAD_GL_VERSION_1_5;
    if (3 < local_38) {
      GLAD_GL_VERSION_1_4 = 1;
    }
    if (4 < local_38) {
      GLAD_GL_VERSION_1_5 = 1;
    }
    if (local_34 != 1) {
      GLAD_GL_VERSION_1_5 = uVar6;
      GLAD_GL_VERSION_1_4 = uVar6;
      GLAD_GL_VERSION_1_3 = uVar6;
      GLAD_GL_VERSION_1_1 = uVar6;
      GLAD_GL_VERSION_1_2 = uVar6;
      GLAD_GL_VERSION_1_0 = uVar6;
    }
    iVar1 = local_34 * 10000 + local_38;
    local_3c = GLAD_GL_VERSION_3_3;
  }
  if (GLAD_GL_VERSION_1_0 != 0) {
    glad_glAccum = (PFNGLACCUMPROC)(*load)(userptr,"glAccum");
    glad_glAlphaFunc = (PFNGLALPHAFUNCPROC)(*load)(userptr,"glAlphaFunc");
    glad_glBegin = (PFNGLBEGINPROC)(*load)(userptr,"glBegin");
    glad_glBitmap = (PFNGLBITMAPPROC)(*load)(userptr,"glBitmap");
    glad_glBlendFunc = (PFNGLBLENDFUNCPROC)(*load)(userptr,"glBlendFunc");
    glad_glCallList = (PFNGLCALLLISTPROC)(*load)(userptr,"glCallList");
    glad_glCallLists = (PFNGLCALLLISTSPROC)(*load)(userptr,"glCallLists");
    glad_glClear = (PFNGLCLEARPROC)(*load)(userptr,"glClear");
    glad_glClearAccum = (PFNGLCLEARACCUMPROC)(*load)(userptr,"glClearAccum");
    glad_glClearColor = (PFNGLCLEARCOLORPROC)(*load)(userptr,"glClearColor");
    glad_glClearDepth = (PFNGLCLEARDEPTHPROC)(*load)(userptr,"glClearDepth");
    glad_glClearIndex = (PFNGLCLEARINDEXPROC)(*load)(userptr,"glClearIndex");
    glad_glClearStencil = (PFNGLCLEARSTENCILPROC)(*load)(userptr,"glClearStencil");
    glad_glClipPlane = (PFNGLCLIPPLANEPROC)(*load)(userptr,"glClipPlane");
    glad_glColor3b = (PFNGLCOLOR3BPROC)(*load)(userptr,"glColor3b");
    glad_glColor3bv = (PFNGLCOLOR3BVPROC)(*load)(userptr,"glColor3bv");
    glad_glColor3d = (PFNGLCOLOR3DPROC)(*load)(userptr,"glColor3d");
    glad_glColor3dv = (PFNGLCOLOR3DVPROC)(*load)(userptr,"glColor3dv");
    glad_glColor3f = (PFNGLCOLOR3FPROC)(*load)(userptr,"glColor3f");
    glad_glColor3fv = (PFNGLCOLOR3FVPROC)(*load)(userptr,"glColor3fv");
    glad_glColor3i = (PFNGLCOLOR3IPROC)(*load)(userptr,"glColor3i");
    glad_glColor3iv = (PFNGLCOLOR3IVPROC)(*load)(userptr,"glColor3iv");
    glad_glColor3s = (PFNGLCOLOR3SPROC)(*load)(userptr,"glColor3s");
    glad_glColor3sv = (PFNGLCOLOR3SVPROC)(*load)(userptr,"glColor3sv");
    glad_glColor3ub = (PFNGLCOLOR3UBPROC)(*load)(userptr,"glColor3ub");
    glad_glColor3ubv = (PFNGLCOLOR3UBVPROC)(*load)(userptr,"glColor3ubv");
    glad_glColor3ui = (PFNGLCOLOR3UIPROC)(*load)(userptr,"glColor3ui");
    glad_glColor3uiv = (PFNGLCOLOR3UIVPROC)(*load)(userptr,"glColor3uiv");
    glad_glColor3us = (PFNGLCOLOR3USPROC)(*load)(userptr,"glColor3us");
    glad_glColor3usv = (PFNGLCOLOR3USVPROC)(*load)(userptr,"glColor3usv");
    glad_glColor4b = (PFNGLCOLOR4BPROC)(*load)(userptr,"glColor4b");
    glad_glColor4bv = (PFNGLCOLOR4BVPROC)(*load)(userptr,"glColor4bv");
    glad_glColor4d = (PFNGLCOLOR4DPROC)(*load)(userptr,"glColor4d");
    glad_glColor4dv = (PFNGLCOLOR4DVPROC)(*load)(userptr,"glColor4dv");
    glad_glColor4f = (PFNGLCOLOR4FPROC)(*load)(userptr,"glColor4f");
    glad_glColor4fv = (PFNGLCOLOR4FVPROC)(*load)(userptr,"glColor4fv");
    glad_glColor4i = (PFNGLCOLOR4IPROC)(*load)(userptr,"glColor4i");
    glad_glColor4iv = (PFNGLCOLOR4IVPROC)(*load)(userptr,"glColor4iv");
    glad_glColor4s = (PFNGLCOLOR4SPROC)(*load)(userptr,"glColor4s");
    glad_glColor4sv = (PFNGLCOLOR4SVPROC)(*load)(userptr,"glColor4sv");
    glad_glColor4ub = (PFNGLCOLOR4UBPROC)(*load)(userptr,"glColor4ub");
    glad_glColor4ubv = (PFNGLCOLOR4UBVPROC)(*load)(userptr,"glColor4ubv");
    glad_glColor4ui = (PFNGLCOLOR4UIPROC)(*load)(userptr,"glColor4ui");
    glad_glColor4uiv = (PFNGLCOLOR4UIVPROC)(*load)(userptr,"glColor4uiv");
    glad_glColor4us = (PFNGLCOLOR4USPROC)(*load)(userptr,"glColor4us");
    glad_glColor4usv = (PFNGLCOLOR4USVPROC)(*load)(userptr,"glColor4usv");
    glad_glColorMask = (PFNGLCOLORMASKPROC)(*load)(userptr,"glColorMask");
    glad_glColorMaterial = (PFNGLCOLORMATERIALPROC)(*load)(userptr,"glColorMaterial");
    glad_glCopyPixels = (PFNGLCOPYPIXELSPROC)(*load)(userptr,"glCopyPixels");
    glad_glCullFace = (PFNGLCULLFACEPROC)(*load)(userptr,"glCullFace");
    glad_glDeleteLists = (PFNGLDELETELISTSPROC)(*load)(userptr,"glDeleteLists");
    glad_glDepthFunc = (PFNGLDEPTHFUNCPROC)(*load)(userptr,"glDepthFunc");
    glad_glDepthMask = (PFNGLDEPTHMASKPROC)(*load)(userptr,"glDepthMask");
    glad_glDepthRange = (PFNGLDEPTHRANGEPROC)(*load)(userptr,"glDepthRange");
    glad_glDisable = (PFNGLDISABLEPROC)(*load)(userptr,"glDisable");
    glad_glDrawBuffer = (PFNGLDRAWBUFFERPROC)(*load)(userptr,"glDrawBuffer");
    glad_glDrawPixels = (PFNGLDRAWPIXELSPROC)(*load)(userptr,"glDrawPixels");
    glad_glEdgeFlag = (PFNGLEDGEFLAGPROC)(*load)(userptr,"glEdgeFlag");
    glad_glEdgeFlagv = (PFNGLEDGEFLAGVPROC)(*load)(userptr,"glEdgeFlagv");
    glad_glEnable = (PFNGLENABLEPROC)(*load)(userptr,"glEnable");
    glad_glEnd = (*load)(userptr,"glEnd");
    glad_glEndList = (*load)(userptr,"glEndList");
    glad_glEvalCoord1d = (PFNGLEVALCOORD1DPROC)(*load)(userptr,"glEvalCoord1d");
    glad_glEvalCoord1dv = (PFNGLEVALCOORD1DVPROC)(*load)(userptr,"glEvalCoord1dv");
    glad_glEvalCoord1f = (PFNGLEVALCOORD1FPROC)(*load)(userptr,"glEvalCoord1f");
    glad_glEvalCoord1fv = (PFNGLEVALCOORD1FVPROC)(*load)(userptr,"glEvalCoord1fv");
    glad_glEvalCoord2d = (PFNGLEVALCOORD2DPROC)(*load)(userptr,"glEvalCoord2d");
    glad_glEvalCoord2dv = (PFNGLEVALCOORD2DVPROC)(*load)(userptr,"glEvalCoord2dv");
    glad_glEvalCoord2f = (PFNGLEVALCOORD2FPROC)(*load)(userptr,"glEvalCoord2f");
    glad_glEvalCoord2fv = (PFNGLEVALCOORD2FVPROC)(*load)(userptr,"glEvalCoord2fv");
    glad_glEvalMesh1 = (PFNGLEVALMESH1PROC)(*load)(userptr,"glEvalMesh1");
    glad_glEvalMesh2 = (PFNGLEVALMESH2PROC)(*load)(userptr,"glEvalMesh2");
    glad_glEvalPoint1 = (PFNGLEVALPOINT1PROC)(*load)(userptr,"glEvalPoint1");
    glad_glEvalPoint2 = (PFNGLEVALPOINT2PROC)(*load)(userptr,"glEvalPoint2");
    glad_glFeedbackBuffer = (PFNGLFEEDBACKBUFFERPROC)(*load)(userptr,"glFeedbackBuffer");
    glad_glFinish = (*load)(userptr,"glFinish");
    glad_glFlush = (*load)(userptr,"glFlush");
    glad_glFogf = (PFNGLFOGFPROC)(*load)(userptr,"glFogf");
    glad_glFogfv = (PFNGLFOGFVPROC)(*load)(userptr,"glFogfv");
    glad_glFogi = (PFNGLFOGIPROC)(*load)(userptr,"glFogi");
    glad_glFogiv = (PFNGLFOGIVPROC)(*load)(userptr,"glFogiv");
    glad_glFrontFace = (PFNGLFRONTFACEPROC)(*load)(userptr,"glFrontFace");
    glad_glFrustum = (PFNGLFRUSTUMPROC)(*load)(userptr,"glFrustum");
    glad_glGenLists = (PFNGLGENLISTSPROC)(*load)(userptr,"glGenLists");
    glad_glGetBooleanv = (PFNGLGETBOOLEANVPROC)(*load)(userptr,"glGetBooleanv");
    glad_glGetClipPlane = (PFNGLGETCLIPPLANEPROC)(*load)(userptr,"glGetClipPlane");
    glad_glGetDoublev = (PFNGLGETDOUBLEVPROC)(*load)(userptr,"glGetDoublev");
    glad_glGetError = (PFNGLGETERRORPROC)(*load)(userptr,"glGetError");
    glad_glGetFloatv = (PFNGLGETFLOATVPROC)(*load)(userptr,"glGetFloatv");
    glad_glGetIntegerv = (PFNGLGETINTEGERVPROC)(*load)(userptr,"glGetIntegerv");
    glad_glGetLightfv = (PFNGLGETLIGHTFVPROC)(*load)(userptr,"glGetLightfv");
    glad_glGetLightiv = (PFNGLGETLIGHTIVPROC)(*load)(userptr,"glGetLightiv");
    glad_glGetMapdv = (PFNGLGETMAPDVPROC)(*load)(userptr,"glGetMapdv");
    glad_glGetMapfv = (PFNGLGETMAPFVPROC)(*load)(userptr,"glGetMapfv");
    glad_glGetMapiv = (PFNGLGETMAPIVPROC)(*load)(userptr,"glGetMapiv");
    glad_glGetMaterialfv = (PFNGLGETMATERIALFVPROC)(*load)(userptr,"glGetMaterialfv");
    glad_glGetMaterialiv = (PFNGLGETMATERIALIVPROC)(*load)(userptr,"glGetMaterialiv");
    glad_glGetPixelMapfv = (PFNGLGETPIXELMAPFVPROC)(*load)(userptr,"glGetPixelMapfv");
    glad_glGetPixelMapuiv = (PFNGLGETPIXELMAPUIVPROC)(*load)(userptr,"glGetPixelMapuiv");
    glad_glGetPixelMapusv = (PFNGLGETPIXELMAPUSVPROC)(*load)(userptr,"glGetPixelMapusv");
    glad_glGetPolygonStipple = (PFNGLGETPOLYGONSTIPPLEPROC)(*load)(userptr,"glGetPolygonStipple");
    glad_glGetString = (PFNGLGETSTRINGPROC)(*load)(userptr,"glGetString");
    glad_glGetTexEnvfv = (PFNGLGETTEXENVFVPROC)(*load)(userptr,"glGetTexEnvfv");
    glad_glGetTexEnviv = (PFNGLGETTEXENVIVPROC)(*load)(userptr,"glGetTexEnviv");
    glad_glGetTexGendv = (PFNGLGETTEXGENDVPROC)(*load)(userptr,"glGetTexGendv");
    glad_glGetTexGenfv = (PFNGLGETTEXGENFVPROC)(*load)(userptr,"glGetTexGenfv");
    glad_glGetTexGeniv = (PFNGLGETTEXGENIVPROC)(*load)(userptr,"glGetTexGeniv");
    glad_glGetTexImage = (PFNGLGETTEXIMAGEPROC)(*load)(userptr,"glGetTexImage");
    glad_glGetTexLevelParameterfv =
         (PFNGLGETTEXLEVELPARAMETERFVPROC)(*load)(userptr,"glGetTexLevelParameterfv");
    glad_glGetTexLevelParameteriv =
         (PFNGLGETTEXLEVELPARAMETERIVPROC)(*load)(userptr,"glGetTexLevelParameteriv");
    glad_glGetTexParameterfv = (PFNGLGETTEXPARAMETERFVPROC)(*load)(userptr,"glGetTexParameterfv");
    glad_glGetTexParameteriv = (PFNGLGETTEXPARAMETERIVPROC)(*load)(userptr,"glGetTexParameteriv");
    glad_glHint = (PFNGLHINTPROC)(*load)(userptr,"glHint");
    glad_glIndexMask = (PFNGLINDEXMASKPROC)(*load)(userptr,"glIndexMask");
    glad_glIndexd = (PFNGLINDEXDPROC)(*load)(userptr,"glIndexd");
    glad_glIndexdv = (PFNGLINDEXDVPROC)(*load)(userptr,"glIndexdv");
    glad_glIndexf = (PFNGLINDEXFPROC)(*load)(userptr,"glIndexf");
    glad_glIndexfv = (PFNGLINDEXFVPROC)(*load)(userptr,"glIndexfv");
    glad_glIndexi = (PFNGLINDEXIPROC)(*load)(userptr,"glIndexi");
    glad_glIndexiv = (PFNGLINDEXIVPROC)(*load)(userptr,"glIndexiv");
    glad_glIndexs = (PFNGLINDEXSPROC)(*load)(userptr,"glIndexs");
    glad_glIndexsv = (PFNGLINDEXSVPROC)(*load)(userptr,"glIndexsv");
    glad_glInitNames = (*load)(userptr,"glInitNames");
    glad_glIsEnabled = (PFNGLISENABLEDPROC)(*load)(userptr,"glIsEnabled");
    glad_glIsList = (PFNGLISLISTPROC)(*load)(userptr,"glIsList");
    glad_glLightModelf = (PFNGLLIGHTMODELFPROC)(*load)(userptr,"glLightModelf");
    glad_glLightModelfv = (PFNGLLIGHTMODELFVPROC)(*load)(userptr,"glLightModelfv");
    glad_glLightModeli = (PFNGLLIGHTMODELIPROC)(*load)(userptr,"glLightModeli");
    glad_glLightModeliv = (PFNGLLIGHTMODELIVPROC)(*load)(userptr,"glLightModeliv");
    glad_glLightf = (PFNGLLIGHTFPROC)(*load)(userptr,"glLightf");
    glad_glLightfv = (PFNGLLIGHTFVPROC)(*load)(userptr,"glLightfv");
    glad_glLighti = (PFNGLLIGHTIPROC)(*load)(userptr,"glLighti");
    glad_glLightiv = (PFNGLLIGHTIVPROC)(*load)(userptr,"glLightiv");
    glad_glLineStipple = (PFNGLLINESTIPPLEPROC)(*load)(userptr,"glLineStipple");
    glad_glLineWidth = (PFNGLLINEWIDTHPROC)(*load)(userptr,"glLineWidth");
    glad_glListBase = (PFNGLLISTBASEPROC)(*load)(userptr,"glListBase");
    glad_glLoadIdentity = (*load)(userptr,"glLoadIdentity");
    glad_glLoadMatrixd = (PFNGLLOADMATRIXDPROC)(*load)(userptr,"glLoadMatrixd");
    glad_glLoadMatrixf = (PFNGLLOADMATRIXFPROC)(*load)(userptr,"glLoadMatrixf");
    glad_glLoadName = (PFNGLLOADNAMEPROC)(*load)(userptr,"glLoadName");
    glad_glLogicOp = (PFNGLLOGICOPPROC)(*load)(userptr,"glLogicOp");
    glad_glMap1d = (PFNGLMAP1DPROC)(*load)(userptr,"glMap1d");
    glad_glMap1f = (PFNGLMAP1FPROC)(*load)(userptr,"glMap1f");
    glad_glMap2d = (PFNGLMAP2DPROC)(*load)(userptr,"glMap2d");
    glad_glMap2f = (PFNGLMAP2FPROC)(*load)(userptr,"glMap2f");
    glad_glMapGrid1d = (PFNGLMAPGRID1DPROC)(*load)(userptr,"glMapGrid1d");
    glad_glMapGrid1f = (PFNGLMAPGRID1FPROC)(*load)(userptr,"glMapGrid1f");
    glad_glMapGrid2d = (PFNGLMAPGRID2DPROC)(*load)(userptr,"glMapGrid2d");
    glad_glMapGrid2f = (PFNGLMAPGRID2FPROC)(*load)(userptr,"glMapGrid2f");
    glad_glMaterialf = (PFNGLMATERIALFPROC)(*load)(userptr,"glMaterialf");
    glad_glMaterialfv = (PFNGLMATERIALFVPROC)(*load)(userptr,"glMaterialfv");
    glad_glMateriali = (PFNGLMATERIALIPROC)(*load)(userptr,"glMateriali");
    glad_glMaterialiv = (PFNGLMATERIALIVPROC)(*load)(userptr,"glMaterialiv");
    glad_glMatrixMode = (PFNGLMATRIXMODEPROC)(*load)(userptr,"glMatrixMode");
    glad_glMultMatrixd = (PFNGLMULTMATRIXDPROC)(*load)(userptr,"glMultMatrixd");
    glad_glMultMatrixf = (PFNGLMULTMATRIXFPROC)(*load)(userptr,"glMultMatrixf");
    glad_glNewList = (PFNGLNEWLISTPROC)(*load)(userptr,"glNewList");
    glad_glNormal3b = (PFNGLNORMAL3BPROC)(*load)(userptr,"glNormal3b");
    glad_glNormal3bv = (PFNGLNORMAL3BVPROC)(*load)(userptr,"glNormal3bv");
    glad_glNormal3d = (PFNGLNORMAL3DPROC)(*load)(userptr,"glNormal3d");
    glad_glNormal3dv = (PFNGLNORMAL3DVPROC)(*load)(userptr,"glNormal3dv");
    glad_glNormal3f = (PFNGLNORMAL3FPROC)(*load)(userptr,"glNormal3f");
    glad_glNormal3fv = (PFNGLNORMAL3FVPROC)(*load)(userptr,"glNormal3fv");
    glad_glNormal3i = (PFNGLNORMAL3IPROC)(*load)(userptr,"glNormal3i");
    glad_glNormal3iv = (PFNGLNORMAL3IVPROC)(*load)(userptr,"glNormal3iv");
    glad_glNormal3s = (PFNGLNORMAL3SPROC)(*load)(userptr,"glNormal3s");
    glad_glNormal3sv = (PFNGLNORMAL3SVPROC)(*load)(userptr,"glNormal3sv");
    glad_glOrtho = (PFNGLORTHOPROC)(*load)(userptr,"glOrtho");
    glad_glPassThrough = (PFNGLPASSTHROUGHPROC)(*load)(userptr,"glPassThrough");
    glad_glPixelMapfv = (PFNGLPIXELMAPFVPROC)(*load)(userptr,"glPixelMapfv");
    glad_glPixelMapuiv = (PFNGLPIXELMAPUIVPROC)(*load)(userptr,"glPixelMapuiv");
    glad_glPixelMapusv = (PFNGLPIXELMAPUSVPROC)(*load)(userptr,"glPixelMapusv");
    glad_glPixelStoref = (PFNGLPIXELSTOREFPROC)(*load)(userptr,"glPixelStoref");
    glad_glPixelStorei = (PFNGLPIXELSTOREIPROC)(*load)(userptr,"glPixelStorei");
    glad_glPixelTransferf = (PFNGLPIXELTRANSFERFPROC)(*load)(userptr,"glPixelTransferf");
    glad_glPixelTransferi = (PFNGLPIXELTRANSFERIPROC)(*load)(userptr,"glPixelTransferi");
    glad_glPixelZoom = (PFNGLPIXELZOOMPROC)(*load)(userptr,"glPixelZoom");
    glad_glPointSize = (PFNGLPOINTSIZEPROC)(*load)(userptr,"glPointSize");
    glad_glPolygonMode = (PFNGLPOLYGONMODEPROC)(*load)(userptr,"glPolygonMode");
    glad_glPolygonStipple = (PFNGLPOLYGONSTIPPLEPROC)(*load)(userptr,"glPolygonStipple");
    glad_glPopAttrib = (*load)(userptr,"glPopAttrib");
    glad_glPopMatrix = (*load)(userptr,"glPopMatrix");
    glad_glPopName = (*load)(userptr,"glPopName");
    glad_glPushAttrib = (PFNGLPUSHATTRIBPROC)(*load)(userptr,"glPushAttrib");
    glad_glPushMatrix = (*load)(userptr,"glPushMatrix");
    glad_glPushName = (PFNGLPUSHNAMEPROC)(*load)(userptr,"glPushName");
    glad_glRasterPos2d = (PFNGLRASTERPOS2DPROC)(*load)(userptr,"glRasterPos2d");
    glad_glRasterPos2dv = (PFNGLRASTERPOS2DVPROC)(*load)(userptr,"glRasterPos2dv");
    glad_glRasterPos2f = (PFNGLRASTERPOS2FPROC)(*load)(userptr,"glRasterPos2f");
    glad_glRasterPos2fv = (PFNGLRASTERPOS2FVPROC)(*load)(userptr,"glRasterPos2fv");
    glad_glRasterPos2i = (PFNGLRASTERPOS2IPROC)(*load)(userptr,"glRasterPos2i");
    glad_glRasterPos2iv = (PFNGLRASTERPOS2IVPROC)(*load)(userptr,"glRasterPos2iv");
    glad_glRasterPos2s = (PFNGLRASTERPOS2SPROC)(*load)(userptr,"glRasterPos2s");
    glad_glRasterPos2sv = (PFNGLRASTERPOS2SVPROC)(*load)(userptr,"glRasterPos2sv");
    glad_glRasterPos3d = (PFNGLRASTERPOS3DPROC)(*load)(userptr,"glRasterPos3d");
    glad_glRasterPos3dv = (PFNGLRASTERPOS3DVPROC)(*load)(userptr,"glRasterPos3dv");
    glad_glRasterPos3f = (PFNGLRASTERPOS3FPROC)(*load)(userptr,"glRasterPos3f");
    glad_glRasterPos3fv = (PFNGLRASTERPOS3FVPROC)(*load)(userptr,"glRasterPos3fv");
    glad_glRasterPos3i = (PFNGLRASTERPOS3IPROC)(*load)(userptr,"glRasterPos3i");
    glad_glRasterPos3iv = (PFNGLRASTERPOS3IVPROC)(*load)(userptr,"glRasterPos3iv");
    glad_glRasterPos3s = (PFNGLRASTERPOS3SPROC)(*load)(userptr,"glRasterPos3s");
    glad_glRasterPos3sv = (PFNGLRASTERPOS3SVPROC)(*load)(userptr,"glRasterPos3sv");
    glad_glRasterPos4d = (PFNGLRASTERPOS4DPROC)(*load)(userptr,"glRasterPos4d");
    glad_glRasterPos4dv = (PFNGLRASTERPOS4DVPROC)(*load)(userptr,"glRasterPos4dv");
    glad_glRasterPos4f = (PFNGLRASTERPOS4FPROC)(*load)(userptr,"glRasterPos4f");
    glad_glRasterPos4fv = (PFNGLRASTERPOS4FVPROC)(*load)(userptr,"glRasterPos4fv");
    glad_glRasterPos4i = (PFNGLRASTERPOS4IPROC)(*load)(userptr,"glRasterPos4i");
    glad_glRasterPos4iv = (PFNGLRASTERPOS4IVPROC)(*load)(userptr,"glRasterPos4iv");
    glad_glRasterPos4s = (PFNGLRASTERPOS4SPROC)(*load)(userptr,"glRasterPos4s");
    glad_glRasterPos4sv = (PFNGLRASTERPOS4SVPROC)(*load)(userptr,"glRasterPos4sv");
    glad_glReadBuffer = (PFNGLREADBUFFERPROC)(*load)(userptr,"glReadBuffer");
    glad_glReadPixels = (PFNGLREADPIXELSPROC)(*load)(userptr,"glReadPixels");
    glad_glRectd = (PFNGLRECTDPROC)(*load)(userptr,"glRectd");
    glad_glRectdv = (PFNGLRECTDVPROC)(*load)(userptr,"glRectdv");
    glad_glRectf = (PFNGLRECTFPROC)(*load)(userptr,"glRectf");
    glad_glRectfv = (PFNGLRECTFVPROC)(*load)(userptr,"glRectfv");
    glad_glRecti = (PFNGLRECTIPROC)(*load)(userptr,"glRecti");
    glad_glRectiv = (PFNGLRECTIVPROC)(*load)(userptr,"glRectiv");
    glad_glRects = (PFNGLRECTSPROC)(*load)(userptr,"glRects");
    glad_glRectsv = (PFNGLRECTSVPROC)(*load)(userptr,"glRectsv");
    glad_glRenderMode = (PFNGLRENDERMODEPROC)(*load)(userptr,"glRenderMode");
    glad_glRotated = (PFNGLROTATEDPROC)(*load)(userptr,"glRotated");
    glad_glRotatef = (PFNGLROTATEFPROC)(*load)(userptr,"glRotatef");
    glad_glScaled = (PFNGLSCALEDPROC)(*load)(userptr,"glScaled");
    glad_glScalef = (PFNGLSCALEFPROC)(*load)(userptr,"glScalef");
    glad_glScissor = (PFNGLSCISSORPROC)(*load)(userptr,"glScissor");
    glad_glSelectBuffer = (PFNGLSELECTBUFFERPROC)(*load)(userptr,"glSelectBuffer");
    glad_glShadeModel = (PFNGLSHADEMODELPROC)(*load)(userptr,"glShadeModel");
    glad_glStencilFunc = (PFNGLSTENCILFUNCPROC)(*load)(userptr,"glStencilFunc");
    glad_glStencilMask = (PFNGLSTENCILMASKPROC)(*load)(userptr,"glStencilMask");
    glad_glStencilOp = (PFNGLSTENCILOPPROC)(*load)(userptr,"glStencilOp");
    glad_glTexCoord1d = (PFNGLTEXCOORD1DPROC)(*load)(userptr,"glTexCoord1d");
    glad_glTexCoord1dv = (PFNGLTEXCOORD1DVPROC)(*load)(userptr,"glTexCoord1dv");
    glad_glTexCoord1f = (PFNGLTEXCOORD1FPROC)(*load)(userptr,"glTexCoord1f");
    glad_glTexCoord1fv = (PFNGLTEXCOORD1FVPROC)(*load)(userptr,"glTexCoord1fv");
    glad_glTexCoord1i = (PFNGLTEXCOORD1IPROC)(*load)(userptr,"glTexCoord1i");
    glad_glTexCoord1iv = (PFNGLTEXCOORD1IVPROC)(*load)(userptr,"glTexCoord1iv");
    glad_glTexCoord1s = (PFNGLTEXCOORD1SPROC)(*load)(userptr,"glTexCoord1s");
    glad_glTexCoord1sv = (PFNGLTEXCOORD1SVPROC)(*load)(userptr,"glTexCoord1sv");
    glad_glTexCoord2d = (PFNGLTEXCOORD2DPROC)(*load)(userptr,"glTexCoord2d");
    glad_glTexCoord2dv = (PFNGLTEXCOORD2DVPROC)(*load)(userptr,"glTexCoord2dv");
    glad_glTexCoord2f = (PFNGLTEXCOORD2FPROC)(*load)(userptr,"glTexCoord2f");
    glad_glTexCoord2fv = (PFNGLTEXCOORD2FVPROC)(*load)(userptr,"glTexCoord2fv");
    glad_glTexCoord2i = (PFNGLTEXCOORD2IPROC)(*load)(userptr,"glTexCoord2i");
    glad_glTexCoord2iv = (PFNGLTEXCOORD2IVPROC)(*load)(userptr,"glTexCoord2iv");
    glad_glTexCoord2s = (PFNGLTEXCOORD2SPROC)(*load)(userptr,"glTexCoord2s");
    glad_glTexCoord2sv = (PFNGLTEXCOORD2SVPROC)(*load)(userptr,"glTexCoord2sv");
    glad_glTexCoord3d = (PFNGLTEXCOORD3DPROC)(*load)(userptr,"glTexCoord3d");
    glad_glTexCoord3dv = (PFNGLTEXCOORD3DVPROC)(*load)(userptr,"glTexCoord3dv");
    glad_glTexCoord3f = (PFNGLTEXCOORD3FPROC)(*load)(userptr,"glTexCoord3f");
    glad_glTexCoord3fv = (PFNGLTEXCOORD3FVPROC)(*load)(userptr,"glTexCoord3fv");
    glad_glTexCoord3i = (PFNGLTEXCOORD3IPROC)(*load)(userptr,"glTexCoord3i");
    glad_glTexCoord3iv = (PFNGLTEXCOORD3IVPROC)(*load)(userptr,"glTexCoord3iv");
    glad_glTexCoord3s = (PFNGLTEXCOORD3SPROC)(*load)(userptr,"glTexCoord3s");
    glad_glTexCoord3sv = (PFNGLTEXCOORD3SVPROC)(*load)(userptr,"glTexCoord3sv");
    glad_glTexCoord4d = (PFNGLTEXCOORD4DPROC)(*load)(userptr,"glTexCoord4d");
    glad_glTexCoord4dv = (PFNGLTEXCOORD4DVPROC)(*load)(userptr,"glTexCoord4dv");
    glad_glTexCoord4f = (PFNGLTEXCOORD4FPROC)(*load)(userptr,"glTexCoord4f");
    glad_glTexCoord4fv = (PFNGLTEXCOORD4FVPROC)(*load)(userptr,"glTexCoord4fv");
    glad_glTexCoord4i = (PFNGLTEXCOORD4IPROC)(*load)(userptr,"glTexCoord4i");
    glad_glTexCoord4iv = (PFNGLTEXCOORD4IVPROC)(*load)(userptr,"glTexCoord4iv");
    glad_glTexCoord4s = (PFNGLTEXCOORD4SPROC)(*load)(userptr,"glTexCoord4s");
    glad_glTexCoord4sv = (PFNGLTEXCOORD4SVPROC)(*load)(userptr,"glTexCoord4sv");
    glad_glTexEnvf = (PFNGLTEXENVFPROC)(*load)(userptr,"glTexEnvf");
    glad_glTexEnvfv = (PFNGLTEXENVFVPROC)(*load)(userptr,"glTexEnvfv");
    glad_glTexEnvi = (PFNGLTEXENVIPROC)(*load)(userptr,"glTexEnvi");
    glad_glTexEnviv = (PFNGLTEXENVIVPROC)(*load)(userptr,"glTexEnviv");
    glad_glTexGend = (PFNGLTEXGENDPROC)(*load)(userptr,"glTexGend");
    glad_glTexGendv = (PFNGLTEXGENDVPROC)(*load)(userptr,"glTexGendv");
    glad_glTexGenf = (PFNGLTEXGENFPROC)(*load)(userptr,"glTexGenf");
    glad_glTexGenfv = (PFNGLTEXGENFVPROC)(*load)(userptr,"glTexGenfv");
    glad_glTexGeni = (PFNGLTEXGENIPROC)(*load)(userptr,"glTexGeni");
    glad_glTexGeniv = (PFNGLTEXGENIVPROC)(*load)(userptr,"glTexGeniv");
    glad_glTexImage1D = (PFNGLTEXIMAGE1DPROC)(*load)(userptr,"glTexImage1D");
    glad_glTexImage2D = (PFNGLTEXIMAGE2DPROC)(*load)(userptr,"glTexImage2D");
    glad_glTexParameterf = (PFNGLTEXPARAMETERFPROC)(*load)(userptr,"glTexParameterf");
    glad_glTexParameterfv = (PFNGLTEXPARAMETERFVPROC)(*load)(userptr,"glTexParameterfv");
    glad_glTexParameteri = (PFNGLTEXPARAMETERIPROC)(*load)(userptr,"glTexParameteri");
    glad_glTexParameteriv = (PFNGLTEXPARAMETERIVPROC)(*load)(userptr,"glTexParameteriv");
    glad_glTranslated = (PFNGLTRANSLATEDPROC)(*load)(userptr,"glTranslated");
    glad_glTranslatef = (PFNGLTRANSLATEFPROC)(*load)(userptr,"glTranslatef");
    glad_glVertex2d = (PFNGLVERTEX2DPROC)(*load)(userptr,"glVertex2d");
    glad_glVertex2dv = (PFNGLVERTEX2DVPROC)(*load)(userptr,"glVertex2dv");
    glad_glVertex2f = (PFNGLVERTEX2FPROC)(*load)(userptr,"glVertex2f");
    glad_glVertex2fv = (PFNGLVERTEX2FVPROC)(*load)(userptr,"glVertex2fv");
    glad_glVertex2i = (PFNGLVERTEX2IPROC)(*load)(userptr,"glVertex2i");
    glad_glVertex2iv = (PFNGLVERTEX2IVPROC)(*load)(userptr,"glVertex2iv");
    glad_glVertex2s = (PFNGLVERTEX2SPROC)(*load)(userptr,"glVertex2s");
    glad_glVertex2sv = (PFNGLVERTEX2SVPROC)(*load)(userptr,"glVertex2sv");
    glad_glVertex3d = (PFNGLVERTEX3DPROC)(*load)(userptr,"glVertex3d");
    glad_glVertex3dv = (PFNGLVERTEX3DVPROC)(*load)(userptr,"glVertex3dv");
    glad_glVertex3f = (PFNGLVERTEX3FPROC)(*load)(userptr,"glVertex3f");
    glad_glVertex3fv = (PFNGLVERTEX3FVPROC)(*load)(userptr,"glVertex3fv");
    glad_glVertex3i = (PFNGLVERTEX3IPROC)(*load)(userptr,"glVertex3i");
    glad_glVertex3iv = (PFNGLVERTEX3IVPROC)(*load)(userptr,"glVertex3iv");
    glad_glVertex3s = (PFNGLVERTEX3SPROC)(*load)(userptr,"glVertex3s");
    glad_glVertex3sv = (PFNGLVERTEX3SVPROC)(*load)(userptr,"glVertex3sv");
    glad_glVertex4d = (PFNGLVERTEX4DPROC)(*load)(userptr,"glVertex4d");
    glad_glVertex4dv = (PFNGLVERTEX4DVPROC)(*load)(userptr,"glVertex4dv");
    glad_glVertex4f = (PFNGLVERTEX4FPROC)(*load)(userptr,"glVertex4f");
    glad_glVertex4fv = (PFNGLVERTEX4FVPROC)(*load)(userptr,"glVertex4fv");
    glad_glVertex4i = (PFNGLVERTEX4IPROC)(*load)(userptr,"glVertex4i");
    glad_glVertex4iv = (PFNGLVERTEX4IVPROC)(*load)(userptr,"glVertex4iv");
    glad_glVertex4s = (PFNGLVERTEX4SPROC)(*load)(userptr,"glVertex4s");
    glad_glVertex4sv = (PFNGLVERTEX4SVPROC)(*load)(userptr,"glVertex4sv");
    glad_glViewport = (PFNGLVIEWPORTPROC)(*load)(userptr,"glViewport");
  }
  if (GLAD_GL_VERSION_1_1 != 0) {
    glad_glAreTexturesResident =
         (PFNGLARETEXTURESRESIDENTPROC)(*load)(userptr,"glAreTexturesResident");
    glad_glArrayElement = (PFNGLARRAYELEMENTPROC)(*load)(userptr,"glArrayElement");
    glad_glBindTexture = (PFNGLBINDTEXTUREPROC)(*load)(userptr,"glBindTexture");
    glad_glColorPointer = (PFNGLCOLORPOINTERPROC)(*load)(userptr,"glColorPointer");
    glad_glCopyTexImage1D = (PFNGLCOPYTEXIMAGE1DPROC)(*load)(userptr,"glCopyTexImage1D");
    glad_glCopyTexImage2D = (PFNGLCOPYTEXIMAGE2DPROC)(*load)(userptr,"glCopyTexImage2D");
    glad_glCopyTexSubImage1D = (PFNGLCOPYTEXSUBIMAGE1DPROC)(*load)(userptr,"glCopyTexSubImage1D");
    glad_glCopyTexSubImage2D = (PFNGLCOPYTEXSUBIMAGE2DPROC)(*load)(userptr,"glCopyTexSubImage2D");
    glad_glDeleteTextures = (PFNGLDELETETEXTURESPROC)(*load)(userptr,"glDeleteTextures");
    glad_glDisableClientState = (PFNGLDISABLECLIENTSTATEPROC)(*load)(userptr,"glDisableClientState")
    ;
    glad_glDrawArrays = (PFNGLDRAWARRAYSPROC)(*load)(userptr,"glDrawArrays");
    glad_glDrawElements = (PFNGLDRAWELEMENTSPROC)(*load)(userptr,"glDrawElements");
    glad_glEdgeFlagPointer = (PFNGLEDGEFLAGPOINTERPROC)(*load)(userptr,"glEdgeFlagPointer");
    glad_glEnableClientState = (PFNGLENABLECLIENTSTATEPROC)(*load)(userptr,"glEnableClientState");
    glad_glGenTextures = (PFNGLGENTEXTURESPROC)(*load)(userptr,"glGenTextures");
    glad_glGetPointerv = (PFNGLGETPOINTERVPROC)(*load)(userptr,"glGetPointerv");
    glad_glIndexPointer = (PFNGLINDEXPOINTERPROC)(*load)(userptr,"glIndexPointer");
    glad_glIndexub = (PFNGLINDEXUBPROC)(*load)(userptr,"glIndexub");
    glad_glIndexubv = (PFNGLINDEXUBVPROC)(*load)(userptr,"glIndexubv");
    glad_glInterleavedArrays = (PFNGLINTERLEAVEDARRAYSPROC)(*load)(userptr,"glInterleavedArrays");
    glad_glIsTexture = (PFNGLISTEXTUREPROC)(*load)(userptr,"glIsTexture");
    glad_glNormalPointer = (PFNGLNORMALPOINTERPROC)(*load)(userptr,"glNormalPointer");
    glad_glPolygonOffset = (PFNGLPOLYGONOFFSETPROC)(*load)(userptr,"glPolygonOffset");
    glad_glPopClientAttrib = (*load)(userptr,"glPopClientAttrib");
    glad_glPrioritizeTextures = (PFNGLPRIORITIZETEXTURESPROC)(*load)(userptr,"glPrioritizeTextures")
    ;
    glad_glPushClientAttrib = (PFNGLPUSHCLIENTATTRIBPROC)(*load)(userptr,"glPushClientAttrib");
    glad_glTexCoordPointer = (PFNGLTEXCOORDPOINTERPROC)(*load)(userptr,"glTexCoordPointer");
    glad_glTexSubImage1D = (PFNGLTEXSUBIMAGE1DPROC)(*load)(userptr,"glTexSubImage1D");
    glad_glTexSubImage2D = (PFNGLTEXSUBIMAGE2DPROC)(*load)(userptr,"glTexSubImage2D");
    glad_glVertexPointer = (PFNGLVERTEXPOINTERPROC)(*load)(userptr,"glVertexPointer");
  }
  if (GLAD_GL_VERSION_1_2 != 0) {
    glad_glCopyTexSubImage3D = (PFNGLCOPYTEXSUBIMAGE3DPROC)(*load)(userptr,"glCopyTexSubImage3D");
    glad_glDrawRangeElements = (PFNGLDRAWRANGEELEMENTSPROC)(*load)(userptr,"glDrawRangeElements");
    glad_glTexImage3D = (PFNGLTEXIMAGE3DPROC)(*load)(userptr,"glTexImage3D");
    glad_glTexSubImage3D = (PFNGLTEXSUBIMAGE3DPROC)(*load)(userptr,"glTexSubImage3D");
  }
  if (GLAD_GL_VERSION_1_3 != 0) {
    glad_glActiveTexture = (PFNGLACTIVETEXTUREPROC)(*load)(userptr,"glActiveTexture");
    glad_glClientActiveTexture =
         (PFNGLCLIENTACTIVETEXTUREPROC)(*load)(userptr,"glClientActiveTexture");
    glad_glCompressedTexImage1D =
         (PFNGLCOMPRESSEDTEXIMAGE1DPROC)(*load)(userptr,"glCompressedTexImage1D");
    glad_glCompressedTexImage2D =
         (PFNGLCOMPRESSEDTEXIMAGE2DPROC)(*load)(userptr,"glCompressedTexImage2D");
    glad_glCompressedTexImage3D =
         (PFNGLCOMPRESSEDTEXIMAGE3DPROC)(*load)(userptr,"glCompressedTexImage3D");
    glad_glCompressedTexSubImage1D =
         (PFNGLCOMPRESSEDTEXSUBIMAGE1DPROC)(*load)(userptr,"glCompressedTexSubImage1D");
    glad_glCompressedTexSubImage2D =
         (PFNGLCOMPRESSEDTEXSUBIMAGE2DPROC)(*load)(userptr,"glCompressedTexSubImage2D");
    glad_glCompressedTexSubImage3D =
         (PFNGLCOMPRESSEDTEXSUBIMAGE3DPROC)(*load)(userptr,"glCompressedTexSubImage3D");
    glad_glGetCompressedTexImage =
         (PFNGLGETCOMPRESSEDTEXIMAGEPROC)(*load)(userptr,"glGetCompressedTexImage");
    glad_glLoadTransposeMatrixd =
         (PFNGLLOADTRANSPOSEMATRIXDPROC)(*load)(userptr,"glLoadTransposeMatrixd");
    glad_glLoadTransposeMatrixf =
         (PFNGLLOADTRANSPOSEMATRIXFPROC)(*load)(userptr,"glLoadTransposeMatrixf");
    glad_glMultTransposeMatrixd =
         (PFNGLMULTTRANSPOSEMATRIXDPROC)(*load)(userptr,"glMultTransposeMatrixd");
    glad_glMultTransposeMatrixf =
         (PFNGLMULTTRANSPOSEMATRIXFPROC)(*load)(userptr,"glMultTransposeMatrixf");
    glad_glMultiTexCoord1d = (PFNGLMULTITEXCOORD1DPROC)(*load)(userptr,"glMultiTexCoord1d");
    glad_glMultiTexCoord1dv = (PFNGLMULTITEXCOORD1DVPROC)(*load)(userptr,"glMultiTexCoord1dv");
    glad_glMultiTexCoord1f = (PFNGLMULTITEXCOORD1FPROC)(*load)(userptr,"glMultiTexCoord1f");
    glad_glMultiTexCoord1fv = (PFNGLMULTITEXCOORD1FVPROC)(*load)(userptr,"glMultiTexCoord1fv");
    glad_glMultiTexCoord1i = (PFNGLMULTITEXCOORD1IPROC)(*load)(userptr,"glMultiTexCoord1i");
    glad_glMultiTexCoord1iv = (PFNGLMULTITEXCOORD1IVPROC)(*load)(userptr,"glMultiTexCoord1iv");
    glad_glMultiTexCoord1s = (PFNGLMULTITEXCOORD1SPROC)(*load)(userptr,"glMultiTexCoord1s");
    glad_glMultiTexCoord1sv = (PFNGLMULTITEXCOORD1SVPROC)(*load)(userptr,"glMultiTexCoord1sv");
    glad_glMultiTexCoord2d = (PFNGLMULTITEXCOORD2DPROC)(*load)(userptr,"glMultiTexCoord2d");
    glad_glMultiTexCoord2dv = (PFNGLMULTITEXCOORD2DVPROC)(*load)(userptr,"glMultiTexCoord2dv");
    glad_glMultiTexCoord2f = (PFNGLMULTITEXCOORD2FPROC)(*load)(userptr,"glMultiTexCoord2f");
    glad_glMultiTexCoord2fv = (PFNGLMULTITEXCOORD2FVPROC)(*load)(userptr,"glMultiTexCoord2fv");
    glad_glMultiTexCoord2i = (PFNGLMULTITEXCOORD2IPROC)(*load)(userptr,"glMultiTexCoord2i");
    glad_glMultiTexCoord2iv = (PFNGLMULTITEXCOORD2IVPROC)(*load)(userptr,"glMultiTexCoord2iv");
    glad_glMultiTexCoord2s = (PFNGLMULTITEXCOORD2SPROC)(*load)(userptr,"glMultiTexCoord2s");
    glad_glMultiTexCoord2sv = (PFNGLMULTITEXCOORD2SVPROC)(*load)(userptr,"glMultiTexCoord2sv");
    glad_glMultiTexCoord3d = (PFNGLMULTITEXCOORD3DPROC)(*load)(userptr,"glMultiTexCoord3d");
    glad_glMultiTexCoord3dv = (PFNGLMULTITEXCOORD3DVPROC)(*load)(userptr,"glMultiTexCoord3dv");
    glad_glMultiTexCoord3f = (PFNGLMULTITEXCOORD3FPROC)(*load)(userptr,"glMultiTexCoord3f");
    glad_glMultiTexCoord3fv = (PFNGLMULTITEXCOORD3FVPROC)(*load)(userptr,"glMultiTexCoord3fv");
    glad_glMultiTexCoord3i = (PFNGLMULTITEXCOORD3IPROC)(*load)(userptr,"glMultiTexCoord3i");
    glad_glMultiTexCoord3iv = (PFNGLMULTITEXCOORD3IVPROC)(*load)(userptr,"glMultiTexCoord3iv");
    glad_glMultiTexCoord3s = (PFNGLMULTITEXCOORD3SPROC)(*load)(userptr,"glMultiTexCoord3s");
    glad_glMultiTexCoord3sv = (PFNGLMULTITEXCOORD3SVPROC)(*load)(userptr,"glMultiTexCoord3sv");
    glad_glMultiTexCoord4d = (PFNGLMULTITEXCOORD4DPROC)(*load)(userptr,"glMultiTexCoord4d");
    glad_glMultiTexCoord4dv = (PFNGLMULTITEXCOORD4DVPROC)(*load)(userptr,"glMultiTexCoord4dv");
    glad_glMultiTexCoord4f = (PFNGLMULTITEXCOORD4FPROC)(*load)(userptr,"glMultiTexCoord4f");
    glad_glMultiTexCoord4fv = (PFNGLMULTITEXCOORD4FVPROC)(*load)(userptr,"glMultiTexCoord4fv");
    glad_glMultiTexCoord4i = (PFNGLMULTITEXCOORD4IPROC)(*load)(userptr,"glMultiTexCoord4i");
    glad_glMultiTexCoord4iv = (PFNGLMULTITEXCOORD4IVPROC)(*load)(userptr,"glMultiTexCoord4iv");
    glad_glMultiTexCoord4s = (PFNGLMULTITEXCOORD4SPROC)(*load)(userptr,"glMultiTexCoord4s");
    glad_glMultiTexCoord4sv = (PFNGLMULTITEXCOORD4SVPROC)(*load)(userptr,"glMultiTexCoord4sv");
    glad_glSampleCoverage = (PFNGLSAMPLECOVERAGEPROC)(*load)(userptr,"glSampleCoverage");
  }
  if (GLAD_GL_VERSION_1_4 != 0) {
    glad_glBlendColor = (PFNGLBLENDCOLORPROC)(*load)(userptr,"glBlendColor");
    glad_glBlendEquation = (PFNGLBLENDEQUATIONPROC)(*load)(userptr,"glBlendEquation");
    glad_glBlendFuncSeparate = (PFNGLBLENDFUNCSEPARATEPROC)(*load)(userptr,"glBlendFuncSeparate");
    glad_glFogCoordPointer = (PFNGLFOGCOORDPOINTERPROC)(*load)(userptr,"glFogCoordPointer");
    glad_glFogCoordd = (PFNGLFOGCOORDDPROC)(*load)(userptr,"glFogCoordd");
    glad_glFogCoorddv = (PFNGLFOGCOORDDVPROC)(*load)(userptr,"glFogCoorddv");
    glad_glFogCoordf = (PFNGLFOGCOORDFPROC)(*load)(userptr,"glFogCoordf");
    glad_glFogCoordfv = (PFNGLFOGCOORDFVPROC)(*load)(userptr,"glFogCoordfv");
    glad_glMultiDrawArrays = (PFNGLMULTIDRAWARRAYSPROC)(*load)(userptr,"glMultiDrawArrays");
    glad_glMultiDrawElements = (PFNGLMULTIDRAWELEMENTSPROC)(*load)(userptr,"glMultiDrawElements");
    glad_glPointParameterf = (PFNGLPOINTPARAMETERFPROC)(*load)(userptr,"glPointParameterf");
    glad_glPointParameterfv = (PFNGLPOINTPARAMETERFVPROC)(*load)(userptr,"glPointParameterfv");
    glad_glPointParameteri = (PFNGLPOINTPARAMETERIPROC)(*load)(userptr,"glPointParameteri");
    glad_glPointParameteriv = (PFNGLPOINTPARAMETERIVPROC)(*load)(userptr,"glPointParameteriv");
    glad_glSecondaryColor3b = (PFNGLSECONDARYCOLOR3BPROC)(*load)(userptr,"glSecondaryColor3b");
    glad_glSecondaryColor3bv = (PFNGLSECONDARYCOLOR3BVPROC)(*load)(userptr,"glSecondaryColor3bv");
    glad_glSecondaryColor3d = (PFNGLSECONDARYCOLOR3DPROC)(*load)(userptr,"glSecondaryColor3d");
    glad_glSecondaryColor3dv = (PFNGLSECONDARYCOLOR3DVPROC)(*load)(userptr,"glSecondaryColor3dv");
    glad_glSecondaryColor3f = (PFNGLSECONDARYCOLOR3FPROC)(*load)(userptr,"glSecondaryColor3f");
    glad_glSecondaryColor3fv = (PFNGLSECONDARYCOLOR3FVPROC)(*load)(userptr,"glSecondaryColor3fv");
    glad_glSecondaryColor3i = (PFNGLSECONDARYCOLOR3IPROC)(*load)(userptr,"glSecondaryColor3i");
    glad_glSecondaryColor3iv = (PFNGLSECONDARYCOLOR3IVPROC)(*load)(userptr,"glSecondaryColor3iv");
    glad_glSecondaryColor3s = (PFNGLSECONDARYCOLOR3SPROC)(*load)(userptr,"glSecondaryColor3s");
    glad_glSecondaryColor3sv = (PFNGLSECONDARYCOLOR3SVPROC)(*load)(userptr,"glSecondaryColor3sv");
    glad_glSecondaryColor3ub = (PFNGLSECONDARYCOLOR3UBPROC)(*load)(userptr,"glSecondaryColor3ub");
    glad_glSecondaryColor3ubv = (PFNGLSECONDARYCOLOR3UBVPROC)(*load)(userptr,"glSecondaryColor3ubv")
    ;
    glad_glSecondaryColor3ui = (PFNGLSECONDARYCOLOR3UIPROC)(*load)(userptr,"glSecondaryColor3ui");
    glad_glSecondaryColor3uiv = (PFNGLSECONDARYCOLOR3UIVPROC)(*load)(userptr,"glSecondaryColor3uiv")
    ;
    glad_glSecondaryColor3us = (PFNGLSECONDARYCOLOR3USPROC)(*load)(userptr,"glSecondaryColor3us");
    glad_glSecondaryColor3usv = (PFNGLSECONDARYCOLOR3USVPROC)(*load)(userptr,"glSecondaryColor3usv")
    ;
    glad_glSecondaryColorPointer =
         (PFNGLSECONDARYCOLORPOINTERPROC)(*load)(userptr,"glSecondaryColorPointer");
    glad_glWindowPos2d = (PFNGLWINDOWPOS2DPROC)(*load)(userptr,"glWindowPos2d");
    glad_glWindowPos2dv = (PFNGLWINDOWPOS2DVPROC)(*load)(userptr,"glWindowPos2dv");
    glad_glWindowPos2f = (PFNGLWINDOWPOS2FPROC)(*load)(userptr,"glWindowPos2f");
    glad_glWindowPos2fv = (PFNGLWINDOWPOS2FVPROC)(*load)(userptr,"glWindowPos2fv");
    glad_glWindowPos2i = (PFNGLWINDOWPOS2IPROC)(*load)(userptr,"glWindowPos2i");
    glad_glWindowPos2iv = (PFNGLWINDOWPOS2IVPROC)(*load)(userptr,"glWindowPos2iv");
    glad_glWindowPos2s = (PFNGLWINDOWPOS2SPROC)(*load)(userptr,"glWindowPos2s");
    glad_glWindowPos2sv = (PFNGLWINDOWPOS2SVPROC)(*load)(userptr,"glWindowPos2sv");
    glad_glWindowPos3d = (PFNGLWINDOWPOS3DPROC)(*load)(userptr,"glWindowPos3d");
    glad_glWindowPos3dv = (PFNGLWINDOWPOS3DVPROC)(*load)(userptr,"glWindowPos3dv");
    glad_glWindowPos3f = (PFNGLWINDOWPOS3FPROC)(*load)(userptr,"glWindowPos3f");
    glad_glWindowPos3fv = (PFNGLWINDOWPOS3FVPROC)(*load)(userptr,"glWindowPos3fv");
    glad_glWindowPos3i = (PFNGLWINDOWPOS3IPROC)(*load)(userptr,"glWindowPos3i");
    glad_glWindowPos3iv = (PFNGLWINDOWPOS3IVPROC)(*load)(userptr,"glWindowPos3iv");
    glad_glWindowPos3s = (PFNGLWINDOWPOS3SPROC)(*load)(userptr,"glWindowPos3s");
    glad_glWindowPos3sv = (PFNGLWINDOWPOS3SVPROC)(*load)(userptr,"glWindowPos3sv");
  }
  if (GLAD_GL_VERSION_1_5 != 0) {
    glad_glBeginQuery = (PFNGLBEGINQUERYPROC)(*load)(userptr,"glBeginQuery");
    glad_glBindBuffer = (PFNGLBINDBUFFERPROC)(*load)(userptr,"glBindBuffer");
    glad_glBufferData = (PFNGLBUFFERDATAPROC)(*load)(userptr,"glBufferData");
    glad_glBufferSubData = (PFNGLBUFFERSUBDATAPROC)(*load)(userptr,"glBufferSubData");
    glad_glDeleteBuffers = (PFNGLDELETEBUFFERSPROC)(*load)(userptr,"glDeleteBuffers");
    glad_glDeleteQueries = (PFNGLDELETEQUERIESPROC)(*load)(userptr,"glDeleteQueries");
    glad_glEndQuery = (PFNGLENDQUERYPROC)(*load)(userptr,"glEndQuery");
    glad_glGenBuffers = (PFNGLGENBUFFERSPROC)(*load)(userptr,"glGenBuffers");
    glad_glGenQueries = (PFNGLGENQUERIESPROC)(*load)(userptr,"glGenQueries");
    glad_glGetBufferParameteriv =
         (PFNGLGETBUFFERPARAMETERIVPROC)(*load)(userptr,"glGetBufferParameteriv");
    glad_glGetBufferPointerv = (PFNGLGETBUFFERPOINTERVPROC)(*load)(userptr,"glGetBufferPointerv");
    glad_glGetBufferSubData = (PFNGLGETBUFFERSUBDATAPROC)(*load)(userptr,"glGetBufferSubData");
    glad_glGetQueryObjectiv = (PFNGLGETQUERYOBJECTIVPROC)(*load)(userptr,"glGetQueryObjectiv");
    glad_glGetQueryObjectuiv = (PFNGLGETQUERYOBJECTUIVPROC)(*load)(userptr,"glGetQueryObjectuiv");
    glad_glGetQueryiv = (PFNGLGETQUERYIVPROC)(*load)(userptr,"glGetQueryiv");
    glad_glIsBuffer = (PFNGLISBUFFERPROC)(*load)(userptr,"glIsBuffer");
    glad_glIsQuery = (PFNGLISQUERYPROC)(*load)(userptr,"glIsQuery");
    glad_glMapBuffer = (PFNGLMAPBUFFERPROC)(*load)(userptr,"glMapBuffer");
    glad_glUnmapBuffer = (PFNGLUNMAPBUFFERPROC)(*load)(userptr,"glUnmapBuffer");
  }
  if (GLAD_GL_VERSION_2_0 != 0) {
    glad_glAttachShader = (PFNGLATTACHSHADERPROC)(*load)(userptr,"glAttachShader");
    glad_glBindAttribLocation = (PFNGLBINDATTRIBLOCATIONPROC)(*load)(userptr,"glBindAttribLocation")
    ;
    glad_glBlendEquationSeparate =
         (PFNGLBLENDEQUATIONSEPARATEPROC)(*load)(userptr,"glBlendEquationSeparate");
    glad_glCompileShader = (PFNGLCOMPILESHADERPROC)(*load)(userptr,"glCompileShader");
    glad_glCreateProgram = (PFNGLCREATEPROGRAMPROC)(*load)(userptr,"glCreateProgram");
    glad_glCreateShader = (PFNGLCREATESHADERPROC)(*load)(userptr,"glCreateShader");
    glad_glDeleteProgram = (PFNGLDELETEPROGRAMPROC)(*load)(userptr,"glDeleteProgram");
    glad_glDeleteShader = (PFNGLDELETESHADERPROC)(*load)(userptr,"glDeleteShader");
    glad_glDetachShader = (PFNGLDETACHSHADERPROC)(*load)(userptr,"glDetachShader");
    glad_glDisableVertexAttribArray =
         (PFNGLDISABLEVERTEXATTRIBARRAYPROC)(*load)(userptr,"glDisableVertexAttribArray");
    glad_glDrawBuffers = (PFNGLDRAWBUFFERSPROC)(*load)(userptr,"glDrawBuffers");
    glad_glEnableVertexAttribArray =
         (PFNGLENABLEVERTEXATTRIBARRAYPROC)(*load)(userptr,"glEnableVertexAttribArray");
    glad_glGetActiveAttrib = (PFNGLGETACTIVEATTRIBPROC)(*load)(userptr,"glGetActiveAttrib");
    glad_glGetActiveUniform = (PFNGLGETACTIVEUNIFORMPROC)(*load)(userptr,"glGetActiveUniform");
    glad_glGetAttachedShaders = (PFNGLGETATTACHEDSHADERSPROC)(*load)(userptr,"glGetAttachedShaders")
    ;
    glad_glGetAttribLocation = (PFNGLGETATTRIBLOCATIONPROC)(*load)(userptr,"glGetAttribLocation");
    glad_glGetProgramInfoLog = (PFNGLGETPROGRAMINFOLOGPROC)(*load)(userptr,"glGetProgramInfoLog");
    glad_glGetProgramiv = (PFNGLGETPROGRAMIVPROC)(*load)(userptr,"glGetProgramiv");
    glad_glGetShaderInfoLog = (PFNGLGETSHADERINFOLOGPROC)(*load)(userptr,"glGetShaderInfoLog");
    glad_glGetShaderSource = (PFNGLGETSHADERSOURCEPROC)(*load)(userptr,"glGetShaderSource");
    glad_glGetShaderiv = (PFNGLGETSHADERIVPROC)(*load)(userptr,"glGetShaderiv");
    glad_glGetUniformLocation = (PFNGLGETUNIFORMLOCATIONPROC)(*load)(userptr,"glGetUniformLocation")
    ;
    glad_glGetUniformfv = (PFNGLGETUNIFORMFVPROC)(*load)(userptr,"glGetUniformfv");
    glad_glGetUniformiv = (PFNGLGETUNIFORMIVPROC)(*load)(userptr,"glGetUniformiv");
    glad_glGetVertexAttribPointerv =
         (PFNGLGETVERTEXATTRIBPOINTERVPROC)(*load)(userptr,"glGetVertexAttribPointerv");
    glad_glGetVertexAttribdv = (PFNGLGETVERTEXATTRIBDVPROC)(*load)(userptr,"glGetVertexAttribdv");
    glad_glGetVertexAttribfv = (PFNGLGETVERTEXATTRIBFVPROC)(*load)(userptr,"glGetVertexAttribfv");
    glad_glGetVertexAttribiv = (PFNGLGETVERTEXATTRIBIVPROC)(*load)(userptr,"glGetVertexAttribiv");
    glad_glIsProgram = (PFNGLISPROGRAMPROC)(*load)(userptr,"glIsProgram");
    glad_glIsShader = (PFNGLISSHADERPROC)(*load)(userptr,"glIsShader");
    glad_glLinkProgram = (PFNGLLINKPROGRAMPROC)(*load)(userptr,"glLinkProgram");
    glad_glShaderSource = (PFNGLSHADERSOURCEPROC)(*load)(userptr,"glShaderSource");
    glad_glStencilFuncSeparate =
         (PFNGLSTENCILFUNCSEPARATEPROC)(*load)(userptr,"glStencilFuncSeparate");
    glad_glStencilMaskSeparate =
         (PFNGLSTENCILMASKSEPARATEPROC)(*load)(userptr,"glStencilMaskSeparate");
    glad_glStencilOpSeparate = (PFNGLSTENCILOPSEPARATEPROC)(*load)(userptr,"glStencilOpSeparate");
    glad_glUniform1f = (PFNGLUNIFORM1FPROC)(*load)(userptr,"glUniform1f");
    glad_glUniform1fv = (PFNGLUNIFORM1FVPROC)(*load)(userptr,"glUniform1fv");
    glad_glUniform1i = (PFNGLUNIFORM1IPROC)(*load)(userptr,"glUniform1i");
    glad_glUniform1iv = (PFNGLUNIFORM1IVPROC)(*load)(userptr,"glUniform1iv");
    glad_glUniform2f = (PFNGLUNIFORM2FPROC)(*load)(userptr,"glUniform2f");
    glad_glUniform2fv = (PFNGLUNIFORM2FVPROC)(*load)(userptr,"glUniform2fv");
    glad_glUniform2i = (PFNGLUNIFORM2IPROC)(*load)(userptr,"glUniform2i");
    glad_glUniform2iv = (PFNGLUNIFORM2IVPROC)(*load)(userptr,"glUniform2iv");
    glad_glUniform3f = (PFNGLUNIFORM3FPROC)(*load)(userptr,"glUniform3f");
    glad_glUniform3fv = (PFNGLUNIFORM3FVPROC)(*load)(userptr,"glUniform3fv");
    glad_glUniform3i = (PFNGLUNIFORM3IPROC)(*load)(userptr,"glUniform3i");
    glad_glUniform3iv = (PFNGLUNIFORM3IVPROC)(*load)(userptr,"glUniform3iv");
    glad_glUniform4f = (PFNGLUNIFORM4FPROC)(*load)(userptr,"glUniform4f");
    glad_glUniform4fv = (PFNGLUNIFORM4FVPROC)(*load)(userptr,"glUniform4fv");
    glad_glUniform4i = (PFNGLUNIFORM4IPROC)(*load)(userptr,"glUniform4i");
    glad_glUniform4iv = (PFNGLUNIFORM4IVPROC)(*load)(userptr,"glUniform4iv");
    glad_glUniformMatrix2fv = (PFNGLUNIFORMMATRIX2FVPROC)(*load)(userptr,"glUniformMatrix2fv");
    glad_glUniformMatrix3fv = (PFNGLUNIFORMMATRIX3FVPROC)(*load)(userptr,"glUniformMatrix3fv");
    glad_glUniformMatrix4fv = (PFNGLUNIFORMMATRIX4FVPROC)(*load)(userptr,"glUniformMatrix4fv");
    glad_glUseProgram = (PFNGLUSEPROGRAMPROC)(*load)(userptr,"glUseProgram");
    glad_glValidateProgram = (PFNGLVALIDATEPROGRAMPROC)(*load)(userptr,"glValidateProgram");
    glad_glVertexAttrib1d = (PFNGLVERTEXATTRIB1DPROC)(*load)(userptr,"glVertexAttrib1d");
    glad_glVertexAttrib1dv = (PFNGLVERTEXATTRIB1DVPROC)(*load)(userptr,"glVertexAttrib1dv");
    glad_glVertexAttrib1f = (PFNGLVERTEXATTRIB1FPROC)(*load)(userptr,"glVertexAttrib1f");
    glad_glVertexAttrib1fv = (PFNGLVERTEXATTRIB1FVPROC)(*load)(userptr,"glVertexAttrib1fv");
    glad_glVertexAttrib1s = (PFNGLVERTEXATTRIB1SPROC)(*load)(userptr,"glVertexAttrib1s");
    glad_glVertexAttrib1sv = (PFNGLVERTEXATTRIB1SVPROC)(*load)(userptr,"glVertexAttrib1sv");
    glad_glVertexAttrib2d = (PFNGLVERTEXATTRIB2DPROC)(*load)(userptr,"glVertexAttrib2d");
    glad_glVertexAttrib2dv = (PFNGLVERTEXATTRIB2DVPROC)(*load)(userptr,"glVertexAttrib2dv");
    glad_glVertexAttrib2f = (PFNGLVERTEXATTRIB2FPROC)(*load)(userptr,"glVertexAttrib2f");
    glad_glVertexAttrib2fv = (PFNGLVERTEXATTRIB2FVPROC)(*load)(userptr,"glVertexAttrib2fv");
    glad_glVertexAttrib2s = (PFNGLVERTEXATTRIB2SPROC)(*load)(userptr,"glVertexAttrib2s");
    glad_glVertexAttrib2sv = (PFNGLVERTEXATTRIB2SVPROC)(*load)(userptr,"glVertexAttrib2sv");
    glad_glVertexAttrib3d = (PFNGLVERTEXATTRIB3DPROC)(*load)(userptr,"glVertexAttrib3d");
    glad_glVertexAttrib3dv = (PFNGLVERTEXATTRIB3DVPROC)(*load)(userptr,"glVertexAttrib3dv");
    glad_glVertexAttrib3f = (PFNGLVERTEXATTRIB3FPROC)(*load)(userptr,"glVertexAttrib3f");
    glad_glVertexAttrib3fv = (PFNGLVERTEXATTRIB3FVPROC)(*load)(userptr,"glVertexAttrib3fv");
    glad_glVertexAttrib3s = (PFNGLVERTEXATTRIB3SPROC)(*load)(userptr,"glVertexAttrib3s");
    glad_glVertexAttrib3sv = (PFNGLVERTEXATTRIB3SVPROC)(*load)(userptr,"glVertexAttrib3sv");
    glad_glVertexAttrib4Nbv = (PFNGLVERTEXATTRIB4NBVPROC)(*load)(userptr,"glVertexAttrib4Nbv");
    glad_glVertexAttrib4Niv = (PFNGLVERTEXATTRIB4NIVPROC)(*load)(userptr,"glVertexAttrib4Niv");
    glad_glVertexAttrib4Nsv = (PFNGLVERTEXATTRIB4NSVPROC)(*load)(userptr,"glVertexAttrib4Nsv");
    glad_glVertexAttrib4Nub = (PFNGLVERTEXATTRIB4NUBPROC)(*load)(userptr,"glVertexAttrib4Nub");
    glad_glVertexAttrib4Nubv = (PFNGLVERTEXATTRIB4NUBVPROC)(*load)(userptr,"glVertexAttrib4Nubv");
    glad_glVertexAttrib4Nuiv = (PFNGLVERTEXATTRIB4NUIVPROC)(*load)(userptr,"glVertexAttrib4Nuiv");
    glad_glVertexAttrib4Nusv = (PFNGLVERTEXATTRIB4NUSVPROC)(*load)(userptr,"glVertexAttrib4Nusv");
    glad_glVertexAttrib4bv = (PFNGLVERTEXATTRIB4BVPROC)(*load)(userptr,"glVertexAttrib4bv");
    glad_glVertexAttrib4d = (PFNGLVERTEXATTRIB4DPROC)(*load)(userptr,"glVertexAttrib4d");
    glad_glVertexAttrib4dv = (PFNGLVERTEXATTRIB4DVPROC)(*load)(userptr,"glVertexAttrib4dv");
    glad_glVertexAttrib4f = (PFNGLVERTEXATTRIB4FPROC)(*load)(userptr,"glVertexAttrib4f");
    glad_glVertexAttrib4fv = (PFNGLVERTEXATTRIB4FVPROC)(*load)(userptr,"glVertexAttrib4fv");
    glad_glVertexAttrib4iv = (PFNGLVERTEXATTRIB4IVPROC)(*load)(userptr,"glVertexAttrib4iv");
    glad_glVertexAttrib4s = (PFNGLVERTEXATTRIB4SPROC)(*load)(userptr,"glVertexAttrib4s");
    glad_glVertexAttrib4sv = (PFNGLVERTEXATTRIB4SVPROC)(*load)(userptr,"glVertexAttrib4sv");
    glad_glVertexAttrib4ubv = (PFNGLVERTEXATTRIB4UBVPROC)(*load)(userptr,"glVertexAttrib4ubv");
    glad_glVertexAttrib4uiv = (PFNGLVERTEXATTRIB4UIVPROC)(*load)(userptr,"glVertexAttrib4uiv");
    glad_glVertexAttrib4usv = (PFNGLVERTEXATTRIB4USVPROC)(*load)(userptr,"glVertexAttrib4usv");
    glad_glVertexAttribPointer =
         (PFNGLVERTEXATTRIBPOINTERPROC)(*load)(userptr,"glVertexAttribPointer");
  }
  if (GLAD_GL_VERSION_2_1 != 0) {
    glad_glUniformMatrix2x3fv = (PFNGLUNIFORMMATRIX2X3FVPROC)(*load)(userptr,"glUniformMatrix2x3fv")
    ;
    glad_glUniformMatrix2x4fv = (PFNGLUNIFORMMATRIX2X4FVPROC)(*load)(userptr,"glUniformMatrix2x4fv")
    ;
    glad_glUniformMatrix3x2fv = (PFNGLUNIFORMMATRIX3X2FVPROC)(*load)(userptr,"glUniformMatrix3x2fv")
    ;
    glad_glUniformMatrix3x4fv = (PFNGLUNIFORMMATRIX3X4FVPROC)(*load)(userptr,"glUniformMatrix3x4fv")
    ;
    glad_glUniformMatrix4x2fv = (PFNGLUNIFORMMATRIX4X2FVPROC)(*load)(userptr,"glUniformMatrix4x2fv")
    ;
    glad_glUniformMatrix4x3fv = (PFNGLUNIFORMMATRIX4X3FVPROC)(*load)(userptr,"glUniformMatrix4x3fv")
    ;
  }
  if (GLAD_GL_VERSION_3_0 != 0) {
    glad_glBeginConditionalRender =
         (PFNGLBEGINCONDITIONALRENDERPROC)(*load)(userptr,"glBeginConditionalRender");
    glad_glBeginTransformFeedback =
         (PFNGLBEGINTRANSFORMFEEDBACKPROC)(*load)(userptr,"glBeginTransformFeedback");
    glad_glBindBufferBase = (PFNGLBINDBUFFERBASEPROC)(*load)(userptr,"glBindBufferBase");
    glad_glBindBufferRange = (PFNGLBINDBUFFERRANGEPROC)(*load)(userptr,"glBindBufferRange");
    glad_glBindFragDataLocation =
         (PFNGLBINDFRAGDATALOCATIONPROC)(*load)(userptr,"glBindFragDataLocation");
    glad_glBindFramebuffer = (PFNGLBINDFRAMEBUFFERPROC)(*load)(userptr,"glBindFramebuffer");
    glad_glBindRenderbuffer = (PFNGLBINDRENDERBUFFERPROC)(*load)(userptr,"glBindRenderbuffer");
    glad_glBindVertexArray = (PFNGLBINDVERTEXARRAYPROC)(*load)(userptr,"glBindVertexArray");
    glad_glBlitFramebuffer = (PFNGLBLITFRAMEBUFFERPROC)(*load)(userptr,"glBlitFramebuffer");
    glad_glCheckFramebufferStatus =
         (PFNGLCHECKFRAMEBUFFERSTATUSPROC)(*load)(userptr,"glCheckFramebufferStatus");
    glad_glClampColor = (PFNGLCLAMPCOLORPROC)(*load)(userptr,"glClampColor");
    glad_glClearBufferfi = (PFNGLCLEARBUFFERFIPROC)(*load)(userptr,"glClearBufferfi");
    glad_glClearBufferfv = (PFNGLCLEARBUFFERFVPROC)(*load)(userptr,"glClearBufferfv");
    glad_glClearBufferiv = (PFNGLCLEARBUFFERIVPROC)(*load)(userptr,"glClearBufferiv");
    glad_glClearBufferuiv = (PFNGLCLEARBUFFERUIVPROC)(*load)(userptr,"glClearBufferuiv");
    glad_glColorMaski = (PFNGLCOLORMASKIPROC)(*load)(userptr,"glColorMaski");
    glad_glDeleteFramebuffers = (PFNGLDELETEFRAMEBUFFERSPROC)(*load)(userptr,"glDeleteFramebuffers")
    ;
    glad_glDeleteRenderbuffers =
         (PFNGLDELETERENDERBUFFERSPROC)(*load)(userptr,"glDeleteRenderbuffers");
    glad_glDeleteVertexArrays = (PFNGLDELETEVERTEXARRAYSPROC)(*load)(userptr,"glDeleteVertexArrays")
    ;
    glad_glDisablei = (PFNGLDISABLEIPROC)(*load)(userptr,"glDisablei");
    glad_glEnablei = (PFNGLENABLEIPROC)(*load)(userptr,"glEnablei");
    glad_glEndConditionalRender = (*load)(userptr,"glEndConditionalRender");
    glad_glEndTransformFeedback = (*load)(userptr,"glEndTransformFeedback");
    glad_glFlushMappedBufferRange =
         (PFNGLFLUSHMAPPEDBUFFERRANGEPROC)(*load)(userptr,"glFlushMappedBufferRange");
    glad_glFramebufferRenderbuffer =
         (PFNGLFRAMEBUFFERRENDERBUFFERPROC)(*load)(userptr,"glFramebufferRenderbuffer");
    glad_glFramebufferTexture1D =
         (PFNGLFRAMEBUFFERTEXTURE1DPROC)(*load)(userptr,"glFramebufferTexture1D");
    glad_glFramebufferTexture2D =
         (PFNGLFRAMEBUFFERTEXTURE2DPROC)(*load)(userptr,"glFramebufferTexture2D");
    glad_glFramebufferTexture3D =
         (PFNGLFRAMEBUFFERTEXTURE3DPROC)(*load)(userptr,"glFramebufferTexture3D");
    glad_glFramebufferTextureLayer =
         (PFNGLFRAMEBUFFERTEXTURELAYERPROC)(*load)(userptr,"glFramebufferTextureLayer");
    glad_glGenFramebuffers = (PFNGLGENFRAMEBUFFERSPROC)(*load)(userptr,"glGenFramebuffers");
    glad_glGenRenderbuffers = (PFNGLGENRENDERBUFFERSPROC)(*load)(userptr,"glGenRenderbuffers");
    glad_glGenVertexArrays = (PFNGLGENVERTEXARRAYSPROC)(*load)(userptr,"glGenVertexArrays");
    glad_glGenerateMipmap = (PFNGLGENERATEMIPMAPPROC)(*load)(userptr,"glGenerateMipmap");
    glad_glGetBooleani_v = (PFNGLGETBOOLEANI_VPROC)(*load)(userptr,"glGetBooleani_v");
    glad_glGetFragDataLocation =
         (PFNGLGETFRAGDATALOCATIONPROC)(*load)(userptr,"glGetFragDataLocation");
    glad_glGetFramebufferAttachmentParameteriv =
         (PFNGLGETFRAMEBUFFERATTACHMENTPARAMETERIVPROC)
         (*load)(userptr,"glGetFramebufferAttachmentParameteriv");
    glad_glGetIntegeri_v = (PFNGLGETINTEGERI_VPROC)(*load)(userptr,"glGetIntegeri_v");
    glad_glGetRenderbufferParameteriv =
         (PFNGLGETRENDERBUFFERPARAMETERIVPROC)(*load)(userptr,"glGetRenderbufferParameteriv");
    glad_glGetStringi = (PFNGLGETSTRINGIPROC)(*load)(userptr,"glGetStringi");
    glad_glGetTexParameterIiv = (PFNGLGETTEXPARAMETERIIVPROC)(*load)(userptr,"glGetTexParameterIiv")
    ;
    glad_glGetTexParameterIuiv =
         (PFNGLGETTEXPARAMETERIUIVPROC)(*load)(userptr,"glGetTexParameterIuiv");
    glad_glGetTransformFeedbackVarying =
         (PFNGLGETTRANSFORMFEEDBACKVARYINGPROC)(*load)(userptr,"glGetTransformFeedbackVarying");
    glad_glGetUniformuiv = (PFNGLGETUNIFORMUIVPROC)(*load)(userptr,"glGetUniformuiv");
    glad_glGetVertexAttribIiv = (PFNGLGETVERTEXATTRIBIIVPROC)(*load)(userptr,"glGetVertexAttribIiv")
    ;
    glad_glGetVertexAttribIuiv =
         (PFNGLGETVERTEXATTRIBIUIVPROC)(*load)(userptr,"glGetVertexAttribIuiv");
    glad_glIsEnabledi = (PFNGLISENABLEDIPROC)(*load)(userptr,"glIsEnabledi");
    glad_glIsFramebuffer = (PFNGLISFRAMEBUFFERPROC)(*load)(userptr,"glIsFramebuffer");
    glad_glIsRenderbuffer = (PFNGLISRENDERBUFFERPROC)(*load)(userptr,"glIsRenderbuffer");
    glad_glIsVertexArray = (PFNGLISVERTEXARRAYPROC)(*load)(userptr,"glIsVertexArray");
    glad_glMapBufferRange = (PFNGLMAPBUFFERRANGEPROC)(*load)(userptr,"glMapBufferRange");
    glad_glRenderbufferStorage =
         (PFNGLRENDERBUFFERSTORAGEPROC)(*load)(userptr,"glRenderbufferStorage");
    glad_glRenderbufferStorageMultisample =
         (PFNGLRENDERBUFFERSTORAGEMULTISAMPLEPROC)
         (*load)(userptr,"glRenderbufferStorageMultisample");
    glad_glTexParameterIiv = (PFNGLTEXPARAMETERIIVPROC)(*load)(userptr,"glTexParameterIiv");
    glad_glTexParameterIuiv = (PFNGLTEXPARAMETERIUIVPROC)(*load)(userptr,"glTexParameterIuiv");
    glad_glTransformFeedbackVaryings =
         (PFNGLTRANSFORMFEEDBACKVARYINGSPROC)(*load)(userptr,"glTransformFeedbackVaryings");
    glad_glUniform1ui = (PFNGLUNIFORM1UIPROC)(*load)(userptr,"glUniform1ui");
    glad_glUniform1uiv = (PFNGLUNIFORM1UIVPROC)(*load)(userptr,"glUniform1uiv");
    glad_glUniform2ui = (PFNGLUNIFORM2UIPROC)(*load)(userptr,"glUniform2ui");
    glad_glUniform2uiv = (PFNGLUNIFORM2UIVPROC)(*load)(userptr,"glUniform2uiv");
    glad_glUniform3ui = (PFNGLUNIFORM3UIPROC)(*load)(userptr,"glUniform3ui");
    glad_glUniform3uiv = (PFNGLUNIFORM3UIVPROC)(*load)(userptr,"glUniform3uiv");
    glad_glUniform4ui = (PFNGLUNIFORM4UIPROC)(*load)(userptr,"glUniform4ui");
    glad_glUniform4uiv = (PFNGLUNIFORM4UIVPROC)(*load)(userptr,"glUniform4uiv");
    glad_glVertexAttribI1i = (PFNGLVERTEXATTRIBI1IPROC)(*load)(userptr,"glVertexAttribI1i");
    glad_glVertexAttribI1iv = (PFNGLVERTEXATTRIBI1IVPROC)(*load)(userptr,"glVertexAttribI1iv");
    glad_glVertexAttribI1ui = (PFNGLVERTEXATTRIBI1UIPROC)(*load)(userptr,"glVertexAttribI1ui");
    glad_glVertexAttribI1uiv = (PFNGLVERTEXATTRIBI1UIVPROC)(*load)(userptr,"glVertexAttribI1uiv");
    glad_glVertexAttribI2i = (PFNGLVERTEXATTRIBI2IPROC)(*load)(userptr,"glVertexAttribI2i");
    glad_glVertexAttribI2iv = (PFNGLVERTEXATTRIBI2IVPROC)(*load)(userptr,"glVertexAttribI2iv");
    glad_glVertexAttribI2ui = (PFNGLVERTEXATTRIBI2UIPROC)(*load)(userptr,"glVertexAttribI2ui");
    glad_glVertexAttribI2uiv = (PFNGLVERTEXATTRIBI2UIVPROC)(*load)(userptr,"glVertexAttribI2uiv");
    glad_glVertexAttribI3i = (PFNGLVERTEXATTRIBI3IPROC)(*load)(userptr,"glVertexAttribI3i");
    glad_glVertexAttribI3iv = (PFNGLVERTEXATTRIBI3IVPROC)(*load)(userptr,"glVertexAttribI3iv");
    glad_glVertexAttribI3ui = (PFNGLVERTEXATTRIBI3UIPROC)(*load)(userptr,"glVertexAttribI3ui");
    glad_glVertexAttribI3uiv = (PFNGLVERTEXATTRIBI3UIVPROC)(*load)(userptr,"glVertexAttribI3uiv");
    glad_glVertexAttribI4bv = (PFNGLVERTEXATTRIBI4BVPROC)(*load)(userptr,"glVertexAttribI4bv");
    glad_glVertexAttribI4i = (PFNGLVERTEXATTRIBI4IPROC)(*load)(userptr,"glVertexAttribI4i");
    glad_glVertexAttribI4iv = (PFNGLVERTEXATTRIBI4IVPROC)(*load)(userptr,"glVertexAttribI4iv");
    glad_glVertexAttribI4sv = (PFNGLVERTEXATTRIBI4SVPROC)(*load)(userptr,"glVertexAttribI4sv");
    glad_glVertexAttribI4ubv = (PFNGLVERTEXATTRIBI4UBVPROC)(*load)(userptr,"glVertexAttribI4ubv");
    glad_glVertexAttribI4ui = (PFNGLVERTEXATTRIBI4UIPROC)(*load)(userptr,"glVertexAttribI4ui");
    glad_glVertexAttribI4uiv = (PFNGLVERTEXATTRIBI4UIVPROC)(*load)(userptr,"glVertexAttribI4uiv");
    glad_glVertexAttribI4usv = (PFNGLVERTEXATTRIBI4USVPROC)(*load)(userptr,"glVertexAttribI4usv");
    glad_glVertexAttribIPointer =
         (PFNGLVERTEXATTRIBIPOINTERPROC)(*load)(userptr,"glVertexAttribIPointer");
  }
  if (GLAD_GL_VERSION_3_1 != 0) {
    glad_glBindBufferBase = (PFNGLBINDBUFFERBASEPROC)(*load)(userptr,"glBindBufferBase");
    glad_glBindBufferRange = (PFNGLBINDBUFFERRANGEPROC)(*load)(userptr,"glBindBufferRange");
    glad_glCopyBufferSubData = (PFNGLCOPYBUFFERSUBDATAPROC)(*load)(userptr,"glCopyBufferSubData");
    glad_glDrawArraysInstanced =
         (PFNGLDRAWARRAYSINSTANCEDPROC)(*load)(userptr,"glDrawArraysInstanced");
    glad_glDrawElementsInstanced =
         (PFNGLDRAWELEMENTSINSTANCEDPROC)(*load)(userptr,"glDrawElementsInstanced");
    glad_glGetActiveUniformBlockName =
         (PFNGLGETACTIVEUNIFORMBLOCKNAMEPROC)(*load)(userptr,"glGetActiveUniformBlockName");
    glad_glGetActiveUniformBlockiv =
         (PFNGLGETACTIVEUNIFORMBLOCKIVPROC)(*load)(userptr,"glGetActiveUniformBlockiv");
    glad_glGetActiveUniformName =
         (PFNGLGETACTIVEUNIFORMNAMEPROC)(*load)(userptr,"glGetActiveUniformName");
    glad_glGetActiveUniformsiv =
         (PFNGLGETACTIVEUNIFORMSIVPROC)(*load)(userptr,"glGetActiveUniformsiv");
    glad_glGetIntegeri_v = (PFNGLGETINTEGERI_VPROC)(*load)(userptr,"glGetIntegeri_v");
    glad_glGetUniformBlockIndex =
         (PFNGLGETUNIFORMBLOCKINDEXPROC)(*load)(userptr,"glGetUniformBlockIndex");
    glad_glGetUniformIndices = (PFNGLGETUNIFORMINDICESPROC)(*load)(userptr,"glGetUniformIndices");
    glad_glPrimitiveRestartIndex =
         (PFNGLPRIMITIVERESTARTINDEXPROC)(*load)(userptr,"glPrimitiveRestartIndex");
    glad_glTexBuffer = (PFNGLTEXBUFFERPROC)(*load)(userptr,"glTexBuffer");
    glad_glUniformBlockBinding =
         (PFNGLUNIFORMBLOCKBINDINGPROC)(*load)(userptr,"glUniformBlockBinding");
  }
  if (GLAD_GL_VERSION_3_2 != 0) {
    glad_glClientWaitSync = (PFNGLCLIENTWAITSYNCPROC)(*load)(userptr,"glClientWaitSync");
    glad_glDeleteSync = (PFNGLDELETESYNCPROC)(*load)(userptr,"glDeleteSync");
    glad_glDrawElementsBaseVertex =
         (PFNGLDRAWELEMENTSBASEVERTEXPROC)(*load)(userptr,"glDrawElementsBaseVertex");
    glad_glDrawElementsInstancedBaseVertex =
         (PFNGLDRAWELEMENTSINSTANCEDBASEVERTEXPROC)
         (*load)(userptr,"glDrawElementsInstancedBaseVertex");
    glad_glDrawRangeElementsBaseVertex =
         (PFNGLDRAWRANGEELEMENTSBASEVERTEXPROC)(*load)(userptr,"glDrawRangeElementsBaseVertex");
    glad_glFenceSync = (PFNGLFENCESYNCPROC)(*load)(userptr,"glFenceSync");
    glad_glFramebufferTexture = (PFNGLFRAMEBUFFERTEXTUREPROC)(*load)(userptr,"glFramebufferTexture")
    ;
    glad_glGetBufferParameteri64v =
         (PFNGLGETBUFFERPARAMETERI64VPROC)(*load)(userptr,"glGetBufferParameteri64v");
    glad_glGetInteger64i_v = (PFNGLGETINTEGER64I_VPROC)(*load)(userptr,"glGetInteger64i_v");
    glad_glGetInteger64v = (PFNGLGETINTEGER64VPROC)(*load)(userptr,"glGetInteger64v");
    glad_glGetMultisamplefv = (PFNGLGETMULTISAMPLEFVPROC)(*load)(userptr,"glGetMultisamplefv");
    glad_glGetSynciv = (PFNGLGETSYNCIVPROC)(*load)(userptr,"glGetSynciv");
    glad_glIsSync = (PFNGLISSYNCPROC)(*load)(userptr,"glIsSync");
    glad_glMultiDrawElementsBaseVertex =
         (PFNGLMULTIDRAWELEMENTSBASEVERTEXPROC)(*load)(userptr,"glMultiDrawElementsBaseVertex");
    glad_glProvokingVertex = (PFNGLPROVOKINGVERTEXPROC)(*load)(userptr,"glProvokingVertex");
    glad_glSampleMaski = (PFNGLSAMPLEMASKIPROC)(*load)(userptr,"glSampleMaski");
    glad_glTexImage2DMultisample =
         (PFNGLTEXIMAGE2DMULTISAMPLEPROC)(*load)(userptr,"glTexImage2DMultisample");
    glad_glTexImage3DMultisample =
         (PFNGLTEXIMAGE3DMULTISAMPLEPROC)(*load)(userptr,"glTexImage3DMultisample");
    glad_glWaitSync = (PFNGLWAITSYNCPROC)(*load)(userptr,"glWaitSync");
  }
  if (GLAD_GL_VERSION_3_3 != 0) {
    glad_glBindFragDataLocationIndexed =
         (PFNGLBINDFRAGDATALOCATIONINDEXEDPROC)(*load)(userptr,"glBindFragDataLocationIndexed");
    glad_glBindSampler = (PFNGLBINDSAMPLERPROC)(*load)(userptr,"glBindSampler");
    glad_glColorP3ui = (PFNGLCOLORP3UIPROC)(*load)(userptr,"glColorP3ui");
    glad_glColorP3uiv = (PFNGLCOLORP3UIVPROC)(*load)(userptr,"glColorP3uiv");
    glad_glColorP4ui = (PFNGLCOLORP4UIPROC)(*load)(userptr,"glColorP4ui");
    glad_glColorP4uiv = (PFNGLCOLORP4UIVPROC)(*load)(userptr,"glColorP4uiv");
    glad_glDeleteSamplers = (PFNGLDELETESAMPLERSPROC)(*load)(userptr,"glDeleteSamplers");
    glad_glGenSamplers = (PFNGLGENSAMPLERSPROC)(*load)(userptr,"glGenSamplers");
    glad_glGetFragDataIndex = (PFNGLGETFRAGDATAINDEXPROC)(*load)(userptr,"glGetFragDataIndex");
    glad_glGetQueryObjecti64v = (PFNGLGETQUERYOBJECTI64VPROC)(*load)(userptr,"glGetQueryObjecti64v")
    ;
    glad_glGetQueryObjectui64v =
         (PFNGLGETQUERYOBJECTUI64VPROC)(*load)(userptr,"glGetQueryObjectui64v");
    glad_glGetSamplerParameterIiv =
         (PFNGLGETSAMPLERPARAMETERIIVPROC)(*load)(userptr,"glGetSamplerParameterIiv");
    glad_glGetSamplerParameterIuiv =
         (PFNGLGETSAMPLERPARAMETERIUIVPROC)(*load)(userptr,"glGetSamplerParameterIuiv");
    glad_glGetSamplerParameterfv =
         (PFNGLGETSAMPLERPARAMETERFVPROC)(*load)(userptr,"glGetSamplerParameterfv");
    glad_glGetSamplerParameteriv =
         (PFNGLGETSAMPLERPARAMETERIVPROC)(*load)(userptr,"glGetSamplerParameteriv");
    glad_glIsSampler = (PFNGLISSAMPLERPROC)(*load)(userptr,"glIsSampler");
    glad_glMultiTexCoordP1ui = (PFNGLMULTITEXCOORDP1UIPROC)(*load)(userptr,"glMultiTexCoordP1ui");
    glad_glMultiTexCoordP1uiv = (PFNGLMULTITEXCOORDP1UIVPROC)(*load)(userptr,"glMultiTexCoordP1uiv")
    ;
    glad_glMultiTexCoordP2ui = (PFNGLMULTITEXCOORDP2UIPROC)(*load)(userptr,"glMultiTexCoordP2ui");
    glad_glMultiTexCoordP2uiv = (PFNGLMULTITEXCOORDP2UIVPROC)(*load)(userptr,"glMultiTexCoordP2uiv")
    ;
    glad_glMultiTexCoordP3ui = (PFNGLMULTITEXCOORDP3UIPROC)(*load)(userptr,"glMultiTexCoordP3ui");
    glad_glMultiTexCoordP3uiv = (PFNGLMULTITEXCOORDP3UIVPROC)(*load)(userptr,"glMultiTexCoordP3uiv")
    ;
    glad_glMultiTexCoordP4ui = (PFNGLMULTITEXCOORDP4UIPROC)(*load)(userptr,"glMultiTexCoordP4ui");
    glad_glMultiTexCoordP4uiv = (PFNGLMULTITEXCOORDP4UIVPROC)(*load)(userptr,"glMultiTexCoordP4uiv")
    ;
    glad_glNormalP3ui = (PFNGLNORMALP3UIPROC)(*load)(userptr,"glNormalP3ui");
    glad_glNormalP3uiv = (PFNGLNORMALP3UIVPROC)(*load)(userptr,"glNormalP3uiv");
    glad_glQueryCounter = (PFNGLQUERYCOUNTERPROC)(*load)(userptr,"glQueryCounter");
    glad_glSamplerParameterIiv =
         (PFNGLSAMPLERPARAMETERIIVPROC)(*load)(userptr,"glSamplerParameterIiv");
    glad_glSamplerParameterIuiv =
         (PFNGLSAMPLERPARAMETERIUIVPROC)(*load)(userptr,"glSamplerParameterIuiv");
    glad_glSamplerParameterf = (PFNGLSAMPLERPARAMETERFPROC)(*load)(userptr,"glSamplerParameterf");
    glad_glSamplerParameterfv = (PFNGLSAMPLERPARAMETERFVPROC)(*load)(userptr,"glSamplerParameterfv")
    ;
    glad_glSamplerParameteri = (PFNGLSAMPLERPARAMETERIPROC)(*load)(userptr,"glSamplerParameteri");
    glad_glSamplerParameteriv = (PFNGLSAMPLERPARAMETERIVPROC)(*load)(userptr,"glSamplerParameteriv")
    ;
    glad_glSecondaryColorP3ui = (PFNGLSECONDARYCOLORP3UIPROC)(*load)(userptr,"glSecondaryColorP3ui")
    ;
    glad_glSecondaryColorP3uiv =
         (PFNGLSECONDARYCOLORP3UIVPROC)(*load)(userptr,"glSecondaryColorP3uiv");
    glad_glTexCoordP1ui = (PFNGLTEXCOORDP1UIPROC)(*load)(userptr,"glTexCoordP1ui");
    glad_glTexCoordP1uiv = (PFNGLTEXCOORDP1UIVPROC)(*load)(userptr,"glTexCoordP1uiv");
    glad_glTexCoordP2ui = (PFNGLTEXCOORDP2UIPROC)(*load)(userptr,"glTexCoordP2ui");
    glad_glTexCoordP2uiv = (PFNGLTEXCOORDP2UIVPROC)(*load)(userptr,"glTexCoordP2uiv");
    glad_glTexCoordP3ui = (PFNGLTEXCOORDP3UIPROC)(*load)(userptr,"glTexCoordP3ui");
    glad_glTexCoordP3uiv = (PFNGLTEXCOORDP3UIVPROC)(*load)(userptr,"glTexCoordP3uiv");
    glad_glTexCoordP4ui = (PFNGLTEXCOORDP4UIPROC)(*load)(userptr,"glTexCoordP4ui");
    glad_glTexCoordP4uiv = (PFNGLTEXCOORDP4UIVPROC)(*load)(userptr,"glTexCoordP4uiv");
    glad_glVertexAttribDivisor =
         (PFNGLVERTEXATTRIBDIVISORPROC)(*load)(userptr,"glVertexAttribDivisor");
    glad_glVertexAttribP1ui = (PFNGLVERTEXATTRIBP1UIPROC)(*load)(userptr,"glVertexAttribP1ui");
    glad_glVertexAttribP1uiv = (PFNGLVERTEXATTRIBP1UIVPROC)(*load)(userptr,"glVertexAttribP1uiv");
    glad_glVertexAttribP2ui = (PFNGLVERTEXATTRIBP2UIPROC)(*load)(userptr,"glVertexAttribP2ui");
    glad_glVertexAttribP2uiv = (PFNGLVERTEXATTRIBP2UIVPROC)(*load)(userptr,"glVertexAttribP2uiv");
    glad_glVertexAttribP3ui = (PFNGLVERTEXATTRIBP3UIPROC)(*load)(userptr,"glVertexAttribP3ui");
    glad_glVertexAttribP3uiv = (PFNGLVERTEXATTRIBP3UIVPROC)(*load)(userptr,"glVertexAttribP3uiv");
    glad_glVertexAttribP4ui = (PFNGLVERTEXATTRIBP4UIPROC)(*load)(userptr,"glVertexAttribP4ui");
    glad_glVertexAttribP4uiv = (PFNGLVERTEXATTRIBP4UIVPROC)(*load)(userptr,"glVertexAttribP4uiv");
    glad_glVertexP2ui = (PFNGLVERTEXP2UIPROC)(*load)(userptr,"glVertexP2ui");
    glad_glVertexP2uiv = (PFNGLVERTEXP2UIVPROC)(*load)(userptr,"glVertexP2uiv");
    glad_glVertexP3ui = (PFNGLVERTEXP3UIPROC)(*load)(userptr,"glVertexP3ui");
    glad_glVertexP3uiv = (PFNGLVERTEXP3UIVPROC)(*load)(userptr,"glVertexP3uiv");
    glad_glVertexP4ui = (PFNGLVERTEXP4UIPROC)(*load)(userptr,"glVertexP4ui");
    glad_glVertexP4uiv = (PFNGLVERTEXP4UIVPROC)(*load)(userptr,"glVertexP4uiv");
  }
  if (iVar1 < 30000) {
    if (glad_glGetString != (PFNGLGETSTRINGPROC)0x0) {
      pGVar3 = (*glad_glGetString)(0x1f03);
      uVar9 = 0;
      exts_i = (char **)0x0;
LAB_00109e80:
      uVar6 = (uint)uVar9;
      iVar2 = glad_gl_has_extension(iVar1,(char *)pGVar3,uVar6,exts_i,"GL_ARB_multisample");
      GLAD_GL_ARB_multisample = iVar2;
      GLAD_GL_ARB_robustness =
           glad_gl_has_extension(iVar1,(char *)pGVar3,uVar6,exts_i,"GL_ARB_robustness");
      GLAD_GL_KHR_debug = glad_gl_has_extension(iVar1,(char *)pGVar3,uVar6,exts_i,"GL_KHR_debug");
      if (exts_i != (char **)0x0) {
        if (uVar6 != 0) {
          uVar11 = 0;
          do {
            free(exts_i[uVar11]);
            uVar11 = uVar11 + 1;
            iVar2 = GLAD_GL_ARB_multisample;
          } while (uVar9 != uVar11);
        }
        free(exts_i);
      }
      if (iVar2 != 0) {
        glad_glSampleCoverageARB =
             (PFNGLSAMPLECOVERAGEARBPROC)(*load)(userptr,"glSampleCoverageARB");
      }
      if (GLAD_GL_ARB_robustness != 0) {
        glad_glGetGraphicsResetStatusARB =
             (PFNGLGETGRAPHICSRESETSTATUSARBPROC)(*load)(userptr,"glGetGraphicsResetStatusARB");
        glad_glGetnColorTableARB =
             (PFNGLGETNCOLORTABLEARBPROC)(*load)(userptr,"glGetnColorTableARB");
        glad_glGetnCompressedTexImageARB =
             (PFNGLGETNCOMPRESSEDTEXIMAGEARBPROC)(*load)(userptr,"glGetnCompressedTexImageARB");
        glad_glGetnConvolutionFilterARB =
             (PFNGLGETNCONVOLUTIONFILTERARBPROC)(*load)(userptr,"glGetnConvolutionFilterARB");
        glad_glGetnHistogramARB = (PFNGLGETNHISTOGRAMARBPROC)(*load)(userptr,"glGetnHistogramARB");
        glad_glGetnMapdvARB = (PFNGLGETNMAPDVARBPROC)(*load)(userptr,"glGetnMapdvARB");
        glad_glGetnMapfvARB = (PFNGLGETNMAPFVARBPROC)(*load)(userptr,"glGetnMapfvARB");
        glad_glGetnMapivARB = (PFNGLGETNMAPIVARBPROC)(*load)(userptr,"glGetnMapivARB");
        glad_glGetnMinmaxARB = (PFNGLGETNMINMAXARBPROC)(*load)(userptr,"glGetnMinmaxARB");
        glad_glGetnPixelMapfvARB =
             (PFNGLGETNPIXELMAPFVARBPROC)(*load)(userptr,"glGetnPixelMapfvARB");
        glad_glGetnPixelMapuivARB =
             (PFNGLGETNPIXELMAPUIVARBPROC)(*load)(userptr,"glGetnPixelMapuivARB");
        glad_glGetnPixelMapusvARB =
             (PFNGLGETNPIXELMAPUSVARBPROC)(*load)(userptr,"glGetnPixelMapusvARB");
        glad_glGetnPolygonStippleARB =
             (PFNGLGETNPOLYGONSTIPPLEARBPROC)(*load)(userptr,"glGetnPolygonStippleARB");
        glad_glGetnSeparableFilterARB =
             (PFNGLGETNSEPARABLEFILTERARBPROC)(*load)(userptr,"glGetnSeparableFilterARB");
        glad_glGetnTexImageARB = (PFNGLGETNTEXIMAGEARBPROC)(*load)(userptr,"glGetnTexImageARB");
        glad_glGetnUniformdvARB = (PFNGLGETNUNIFORMDVARBPROC)(*load)(userptr,"glGetnUniformdvARB");
        glad_glGetnUniformfvARB = (PFNGLGETNUNIFORMFVARBPROC)(*load)(userptr,"glGetnUniformfvARB");
        glad_glGetnUniformivARB = (PFNGLGETNUNIFORMIVARBPROC)(*load)(userptr,"glGetnUniformivARB");
        glad_glGetnUniformuivARB =
             (PFNGLGETNUNIFORMUIVARBPROC)(*load)(userptr,"glGetnUniformuivARB");
        glad_glReadnPixelsARB = (PFNGLREADNPIXELSARBPROC)(*load)(userptr,"glReadnPixelsARB");
      }
      if (GLAD_GL_KHR_debug == 0) {
        return iVar1;
      }
      glad_glDebugMessageCallback =
           (PFNGLDEBUGMESSAGECALLBACKPROC)(*load)(userptr,"glDebugMessageCallback");
      glad_glDebugMessageControl =
           (PFNGLDEBUGMESSAGECONTROLPROC)(*load)(userptr,"glDebugMessageControl");
      glad_glDebugMessageInsert =
           (PFNGLDEBUGMESSAGEINSERTPROC)(*load)(userptr,"glDebugMessageInsert");
      glad_glGetDebugMessageLog =
           (PFNGLGETDEBUGMESSAGELOGPROC)(*load)(userptr,"glGetDebugMessageLog");
      glad_glGetObjectLabel = (PFNGLGETOBJECTLABELPROC)(*load)(userptr,"glGetObjectLabel");
      glad_glGetObjectPtrLabel = (PFNGLGETOBJECTPTRLABELPROC)(*load)(userptr,"glGetObjectPtrLabel");
      glad_glGetPointerv = (PFNGLGETPOINTERVPROC)(*load)(userptr,"glGetPointerv");
      glad_glObjectLabel = (PFNGLOBJECTLABELPROC)(*load)(userptr,"glObjectLabel");
      glad_glObjectPtrLabel = (PFNGLOBJECTPTRLABELPROC)(*load)(userptr,"glObjectPtrLabel");
      glad_glPopDebugGroup = (*load)(userptr,"glPopDebugGroup");
      glad_glPushDebugGroup = (PFNGLPUSHDEBUGGROUPPROC)(*load)(userptr,"glPushDebugGroup");
      return iVar1;
    }
  }
  else {
    local_40 = 0;
    if (glad_glGetIntegerv != (PFNGLGETINTEGERVPROC)0x0 &&
        glad_glGetStringi != (PFNGLGETSTRINGIPROC)0x0) {
      (*glad_glGetIntegerv)(0x821d,(GLint *)&local_40);
      if (((ulong)local_40 != 0) &&
         (exts_i = (char **)malloc((ulong)local_40 << 3), exts_i != (char **)0x0)) {
        uVar11 = 0;
        do {
          pGVar3 = (*glad_glGetStringi)(0x1f03,(GLuint)uVar11);
          sVar4 = strlen((char *)pGVar3);
          pcVar5 = (char *)malloc(sVar4 + 1);
          if (pcVar5 != (char *)0x0) {
            memcpy(pcVar5,pGVar3,sVar4 + 1);
          }
          exts_i[uVar11] = pcVar5;
          uVar11 = uVar11 + 1;
          uVar9 = (ulong)local_40;
        } while (uVar11 < uVar9);
        pGVar3 = (GLubyte *)0x0;
        goto LAB_00109e80;
      }
    }
  }
  return 0;
}

Assistant:

int gladLoadGLUserPtr( GLADuserptrloadfunc load, void *userptr) {
    int version;

    glad_glGetString = (PFNGLGETSTRINGPROC) load(userptr, "glGetString");
    if(glad_glGetString == NULL) return 0;
    if(glad_glGetString(GL_VERSION) == NULL) return 0;
    version = glad_gl_find_core_gl();

    glad_gl_load_GL_VERSION_1_0(load, userptr);
    glad_gl_load_GL_VERSION_1_1(load, userptr);
    glad_gl_load_GL_VERSION_1_2(load, userptr);
    glad_gl_load_GL_VERSION_1_3(load, userptr);
    glad_gl_load_GL_VERSION_1_4(load, userptr);
    glad_gl_load_GL_VERSION_1_5(load, userptr);
    glad_gl_load_GL_VERSION_2_0(load, userptr);
    glad_gl_load_GL_VERSION_2_1(load, userptr);
    glad_gl_load_GL_VERSION_3_0(load, userptr);
    glad_gl_load_GL_VERSION_3_1(load, userptr);
    glad_gl_load_GL_VERSION_3_2(load, userptr);
    glad_gl_load_GL_VERSION_3_3(load, userptr);

    if (!glad_gl_find_extensions_gl(version)) return 0;
    glad_gl_load_GL_ARB_multisample(load, userptr);
    glad_gl_load_GL_ARB_robustness(load, userptr);
    glad_gl_load_GL_KHR_debug(load, userptr);



    return version;
}